

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_tanh>(Mat *a,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [24];
  undefined1 auVar69 [40];
  undefined1 auVar70 [48];
  undefined1 auVar71 [56];
  undefined1 auVar72 [24];
  long *in_RDI;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  float fVar78;
  float fVar79;
  undefined1 auVar77 [32];
  undefined1 auVar80 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tanh op;
  Mat *m;
  __m512 two;
  __m512 one;
  __m512 one_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one_2;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 two_1;
  __m256 one_3;
  __m256 one_4;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m128 two_2;
  __m128 one_6;
  __m128 one_7;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_8;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined1 local_2930 [16];
  undefined1 local_2920 [32];
  undefined1 local_2900 [64];
  int local_28bc;
  undefined8 local_28b8;
  undefined8 local_28b0;
  undefined8 local_28a8;
  undefined4 local_28a0;
  long local_2898;
  undefined4 local_2890;
  undefined4 local_288c;
  undefined4 local_2888;
  undefined4 local_2884;
  undefined4 local_2880;
  undefined8 local_2878;
  undefined1 (*local_2870) [64];
  int local_2868;
  int local_2864;
  int local_2860;
  int local_285c;
  int local_2858;
  int local_2854;
  int local_2850;
  undefined1 local_2849 [9];
  long *local_2840;
  undefined1 local_2835;
  int local_2834;
  undefined8 *local_2828;
  undefined8 *local_2820;
  undefined8 *local_2810;
  undefined1 (*local_2808) [64];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 (*local_2790) [64];
  undefined1 (*local_2788) [64];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined1 (*local_2760) [64];
  undefined1 (*local_2758) [64];
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined1 (*local_2740) [64];
  long local_2738;
  undefined4 local_272c;
  long local_2728;
  undefined1 (*local_2720) [64];
  undefined4 local_2714;
  int local_2710;
  int local_270c;
  undefined8 *local_2708;
  undefined4 local_26fc;
  long local_26f8;
  undefined8 *local_26e8;
  undefined1 *local_26c0;
  undefined1 *local_26b8;
  undefined1 *local_26b0;
  undefined1 *local_26a8;
  undefined1 *local_26a0;
  undefined1 *local_2698;
  undefined1 (*local_2690) [64];
  undefined1 *local_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [64];
  undefined4 local_24c4;
  undefined1 local_24c0 [64];
  undefined4 local_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined1 local_23c0 [64];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [64];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined1 local_2240 [64];
  undefined1 local_2200 [8];
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  ushort local_2182;
  float local_2180 [2];
  float afStack_2178 [2];
  float afStack_2170 [2];
  float afStack_2168 [2];
  float afStack_2160 [2];
  float afStack_2158 [2];
  float afStack_2150 [2];
  float afStack_2148 [2];
  undefined1 local_2140 [64];
  undefined1 local_2100 [16];
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  float local_1ec0 [2];
  float afStack_1eb8 [2];
  float afStack_1eb0 [2];
  float afStack_1ea8 [2];
  float afStack_1ea0 [2];
  float afStack_1e98 [2];
  float afStack_1e90 [2];
  float afStack_1e88 [2];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  float local_1e40 [2];
  float afStack_1e38 [2];
  float afStack_1e30 [2];
  float afStack_1e28 [2];
  float afStack_1e20 [2];
  float afStack_1e18 [2];
  float afStack_1e10 [2];
  float afStack_1e08 [2];
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00 [2];
  float afStack_1cf8 [2];
  float afStack_1cf0 [2];
  float afStack_1ce8 [2];
  float afStack_1ce0 [2];
  float afStack_1cd8 [2];
  float afStack_1cd0 [2];
  float afStack_1cc8 [2];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40 [2];
  float afStack_1c38 [2];
  float afStack_1c30 [2];
  float afStack_1c28 [2];
  float afStack_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float local_1b80 [2];
  float afStack_1b78 [2];
  float afStack_1b70 [2];
  float afStack_1b68 [2];
  float afStack_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float afStack_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00 [2];
  float afStack_19f8 [2];
  float afStack_19f0 [2];
  float afStack_19e8 [2];
  float afStack_19e0 [2];
  float afStack_19d8 [2];
  float afStack_19d0 [2];
  float afStack_19c8 [2];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  float local_1980 [2];
  float afStack_1978 [2];
  float afStack_1970 [2];
  float afStack_1968 [2];
  float afStack_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  float local_1940 [2];
  float afStack_1938 [2];
  float afStack_1930 [2];
  float afStack_1928 [2];
  float afStack_1920 [2];
  float afStack_1918 [2];
  float afStack_1910 [2];
  float afStack_1908 [2];
  float local_1900 [2];
  float afStack_18f8 [2];
  float afStack_18f0 [2];
  float afStack_18e8 [2];
  float afStack_18e0 [2];
  float afStack_18d8 [2];
  float afStack_18d0 [2];
  float afStack_18c8 [2];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float afStack_1860 [2];
  float afStack_1858 [2];
  float afStack_1850 [2];
  float afStack_1848 [2];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  ushort local_17c2;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  float local_1780 [2];
  float afStack_1778 [2];
  float afStack_1770 [2];
  float afStack_1768 [2];
  float afStack_1760 [2];
  float afStack_1758 [2];
  float afStack_1750 [2];
  float afStack_1748 [2];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  float local_16c0 [2];
  float afStack_16b8 [2];
  float afStack_16b0 [2];
  float afStack_16a8 [2];
  float afStack_16a0 [2];
  float afStack_1698 [2];
  float afStack_1690 [2];
  float afStack_1688 [2];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_1600 [2];
  float afStack_15f8 [2];
  float afStack_15f0 [2];
  float afStack_15e8 [2];
  float afStack_15e0 [2];
  float afStack_15d8 [2];
  float afStack_15d0 [2];
  float afStack_15c8 [2];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  float afStack_1560 [2];
  float afStack_1558 [2];
  float afStack_1550 [2];
  float afStack_1548 [2];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined4 local_1384;
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined4 local_1284;
  undefined1 local_1280 [64];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined4 local_1128;
  undefined4 local_1124;
  undefined1 local_1120 [16];
  undefined1 auStack_1110 [16];
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined4 local_10e4;
  undefined1 local_10e0 [16];
  undefined1 auStack_10d0 [16];
  undefined4 local_10c0;
  undefined4 local_10bc;
  undefined4 local_10b8;
  undefined4 local_10b4;
  undefined4 local_10b0;
  undefined4 local_10ac;
  undefined4 local_10a8;
  undefined4 local_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [8];
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [32];
  undefined4 local_f40;
  undefined4 uStack_f3c;
  undefined4 uStack_f38;
  undefined4 uStack_f34;
  undefined4 uStack_f30;
  undefined4 uStack_f2c;
  undefined4 uStack_f28;
  undefined4 uStack_f24;
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined1 local_ee0 [8];
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined4 local_d60;
  undefined4 uStack_d5c;
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined4 uStack_d50;
  undefined4 uStack_d4c;
  undefined4 uStack_d48;
  undefined4 uStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined4 local_d20;
  undefined4 uStack_d1c;
  undefined4 uStack_d18;
  undefined4 uStack_d14;
  undefined4 uStack_d10;
  undefined4 uStack_d0c;
  undefined4 uStack_d08;
  undefined4 uStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  undefined1 *local_cc8;
  float *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  float *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  float *local_c90;
  undefined1 *local_c88;
  undefined1 *local_c80;
  float *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  float *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  float *local_c48;
  float *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  float *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  float *local_c10;
  undefined1 *local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined4 local_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0 [2];
  float afStack_ad8 [2];
  float afStack_ad0 [2];
  float afStack_ac8 [2];
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  float local_a80 [2];
  float afStack_a78 [2];
  float afStack_a70 [2];
  float afStack_a68 [2];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  float afStack_a10 [2];
  float afStack_a08 [2];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  float afStack_9b0 [2];
  float afStack_9a8 [2];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820 [2];
  float afStack_818 [2];
  float afStack_810 [2];
  float afStack_808 [2];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float local_7c0 [2];
  float afStack_7b8 [2];
  float afStack_7b0 [2];
  float afStack_7a8 [2];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined4 local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined4 local_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined4 local_594;
  undefined8 local_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530 [8];
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined4 local_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [8];
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 local_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 *local_310;
  float *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  float *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  float *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  float *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  float *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_74;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 local_60 [16];
  
  local_2850 = *(int *)((long)in_RDI + 0x2c);
  local_2854 = (int)in_RDI[6];
  local_2858 = *(int *)((long)in_RDI + 0x34);
  local_285c = (int)in_RDI[7];
  local_2860 = (int)in_RDI[3];
  local_2864 = local_2850 * local_2854 * local_2858 * local_2860;
  local_2840 = in_RDI;
  for (local_2868 = 0; local_2868 < local_285c; local_2868 = local_2868 + 1) {
    local_2828 = &local_28b8;
    local_270c = *(int *)((long)local_2840 + 0x2c);
    local_2710 = (int)local_2840[6];
    local_2714 = *(undefined4 *)((long)local_2840 + 0x34);
    local_2720 = (undefined1 (*) [64])
                 (*local_2840 + local_2840[8] * (long)local_2868 * local_2840[2]);
    local_2728 = local_2840[2];
    local_272c = (undefined4)local_2840[3];
    local_2738 = local_2840[4];
    local_2708 = &local_28b8;
    local_26f8 = (long)local_270c * (long)local_2710 * local_2728;
    local_2820 = &local_28b8;
    local_2810 = &local_28b8;
    local_26fc = 0x10;
    local_2834 = local_2868;
    local_2835 = 1;
    local_28b8 = 0;
    local_28a8 = 0;
    local_28a0 = 0;
    local_2890 = 0;
    local_288c = 0;
    local_2888 = 0;
    local_2884 = 0;
    local_2880 = 0;
    local_2878 = 0;
    local_28b0 = 0;
    local_2870 = local_2720;
    for (local_28bc = 0; local_28bc + 0xf < local_2864; local_28bc = local_28bc + 0x10) {
      local_2808 = local_2870;
      auVar74 = *local_2870;
      local_26b8 = local_2849;
      local_26c0 = local_2900;
      local_2900._0_8_ = auVar74._0_8_;
      local_2600 = local_2900._0_8_;
      local_2900._8_8_ = auVar74._8_8_;
      uStack_25f8 = local_2900._8_8_;
      local_2900._16_8_ = auVar74._16_8_;
      uStack_25f0 = local_2900._16_8_;
      local_2900._24_8_ = auVar74._24_8_;
      uStack_25e8 = local_2900._24_8_;
      local_2900._32_8_ = auVar74._32_8_;
      uStack_25e0 = local_2900._32_8_;
      local_2900._40_8_ = auVar74._40_8_;
      uStack_25d8 = local_2900._40_8_;
      local_2900._48_8_ = auVar74._48_8_;
      uStack_25d0 = local_2900._48_8_;
      local_2900._56_8_ = auVar74._56_8_;
      uStack_25c8 = local_2900._56_8_;
      local_2444 = 0x3f800000;
      local_24c0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2640 = local_24c0._0_8_;
      uStack_2638 = local_24c0._8_8_;
      uStack_2630 = local_24c0._16_8_;
      uStack_2628 = local_24c0._24_8_;
      uStack_2620 = local_24c0._32_8_;
      uStack_2618 = local_24c0._40_8_;
      uStack_2610 = local_24c0._48_8_;
      uStack_2608 = local_24c0._56_8_;
      local_24c4 = 0x40000000;
      local_2540 = vbroadcastss_avx512f(ZEXT416(0x40000000));
      local_2680 = local_2540._0_8_;
      uStack_2678 = local_2540._8_8_;
      uStack_2670 = local_2540._16_8_;
      uStack_2668 = local_2540._24_8_;
      uStack_2660 = local_2540._32_8_;
      uStack_2658 = local_2540._40_8_;
      uStack_2650 = local_2540._48_8_;
      uStack_2648 = local_2540._56_8_;
      local_25c0 = local_2540._0_8_;
      uStack_25b8 = local_2540._8_8_;
      uStack_25b0 = local_2540._16_8_;
      uStack_25a8 = local_2540._24_8_;
      uStack_25a0 = local_2540._32_8_;
      uStack_2598 = local_2540._40_8_;
      uStack_2590 = local_2540._48_8_;
      uStack_2588 = local_2540._56_8_;
      local_2340 = vmulps_avx512f(auVar74,local_2540);
      local_1284 = 0x3f800000;
      local_1300 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2380 = local_1300._0_8_;
      uStack_2378 = local_1300._8_8_;
      uStack_2370 = local_1300._16_8_;
      uStack_2368 = local_1300._24_8_;
      uStack_2360 = local_1300._32_8_;
      uStack_2358 = local_1300._40_8_;
      uStack_2350 = local_1300._48_8_;
      uStack_2348 = local_1300._56_8_;
      local_14c0 = local_1300._0_8_;
      uStack_14b8 = local_1300._8_8_;
      uStack_14b0 = local_1300._16_8_;
      uStack_14a8 = local_1300._24_8_;
      uStack_14a0 = local_1300._32_8_;
      uStack_1498 = local_1300._40_8_;
      uStack_1490 = local_1300._48_8_;
      uStack_1488 = local_1300._56_8_;
      local_2280 = 0;
      uStack_2278 = 0;
      uStack_2270 = 0;
      uStack_2268 = 0;
      uStack_2260 = 0;
      uStack_2258 = 0;
      uStack_2250 = 0;
      uStack_2248 = 0;
      local_22c0 = 0;
      uStack_22b8 = 0;
      uStack_22b0 = 0;
      uStack_22a8 = 0;
      uStack_22a0 = 0;
      uStack_2298 = 0;
      uStack_2290 = 0;
      uStack_2288 = 0;
      local_2300 = local_2340._0_8_;
      uStack_22f8 = local_2340._8_8_;
      uStack_22f0 = local_2340._16_8_;
      uStack_22e8 = local_2340._24_8_;
      uStack_22e0 = local_2340._32_8_;
      uStack_22d8 = local_2340._40_8_;
      uStack_22d0 = local_2340._48_8_;
      uStack_22c8 = local_2340._56_8_;
      auVar73 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_2340);
      local_2000 = 0;
      uStack_1ff8 = 0;
      uStack_1ff0 = 0;
      uStack_1fe8 = 0;
      uStack_1fe0 = 0;
      uStack_1fd8 = 0;
      uStack_1fd0 = 0;
      uStack_1fc8 = 0;
      local_2180[0] = 1.0;
      local_2180[1] = 1.0;
      afStack_2178[0] = 1.0;
      afStack_2178[1] = 1.0;
      afStack_2170[0] = 1.0;
      afStack_2170[1] = 1.0;
      afStack_2168[0] = 1.0;
      afStack_2168[1] = 1.0;
      afStack_2160[0] = 1.0;
      afStack_2160[1] = 1.0;
      afStack_2158[0] = 1.0;
      afStack_2158[1] = 1.0;
      afStack_2150[0] = 1.0;
      afStack_2150[1] = 1.0;
      afStack_2148[0] = 1.0;
      afStack_2148[1] = 1.0;
      local_2080._0_8_ = auVar73._0_8_;
      local_1e80 = local_2080._0_8_;
      local_2080._8_8_ = auVar73._8_8_;
      uStack_1e78 = local_2080._8_8_;
      local_2080._16_8_ = auVar73._16_8_;
      uStack_1e70 = local_2080._16_8_;
      local_2080._24_8_ = auVar73._24_8_;
      uStack_1e68 = local_2080._24_8_;
      local_2080._32_8_ = auVar73._32_8_;
      uStack_1e60 = local_2080._32_8_;
      local_2080._40_8_ = auVar73._40_8_;
      uStack_1e58 = local_2080._40_8_;
      local_2080._48_8_ = auVar73._48_8_;
      uStack_1e50 = local_2080._48_8_;
      local_2080._56_8_ = auVar73._56_8_;
      uStack_1e48 = local_2080._56_8_;
      local_1ec0[0] = 88.37626;
      local_1ec0[1] = 88.37626;
      afStack_1eb8[0] = 88.37626;
      afStack_1eb8[1] = 88.37626;
      afStack_1eb0[0] = 88.37626;
      afStack_1eb0[1] = 88.37626;
      afStack_1ea8[0] = 88.37626;
      afStack_1ea8[1] = 88.37626;
      afStack_1ea0[0] = 88.37626;
      afStack_1ea0[1] = 88.37626;
      afStack_1e98[0] = 88.37626;
      afStack_1e98[1] = 88.37626;
      afStack_1e90[0] = 88.37626;
      afStack_1e90[1] = 88.37626;
      afStack_1e88[0] = 88.37626;
      afStack_1e88[1] = 88.37626;
      auVar74._8_4_ = 88.37626;
      auVar74._12_4_ = 88.37626;
      auVar74._0_4_ = 88.37626;
      auVar74._4_4_ = 88.37626;
      auVar74._16_4_ = 88.37626;
      auVar74._20_4_ = 88.37626;
      auVar74._24_4_ = 88.37626;
      auVar74._28_4_ = 88.37626;
      auVar74._32_4_ = 88.37626;
      auVar74._36_4_ = 88.37626;
      auVar74._40_4_ = 88.37626;
      auVar74._44_4_ = 88.37626;
      auVar74._48_4_ = 88.37626;
      auVar74._52_4_ = 88.37626;
      auVar74._56_4_ = 88.37626;
      auVar74._60_4_ = 88.37626;
      auVar74 = vminps_avx512f(auVar73,auVar74);
      local_2080._0_8_ = auVar74._0_8_;
      local_1e00 = local_2080._0_8_;
      local_2080._8_8_ = auVar74._8_8_;
      uStack_1df8 = local_2080._8_8_;
      local_2080._16_8_ = auVar74._16_8_;
      uStack_1df0 = local_2080._16_8_;
      local_2080._24_8_ = auVar74._24_8_;
      uStack_1de8 = local_2080._24_8_;
      local_2080._32_8_ = auVar74._32_8_;
      uStack_1de0 = local_2080._32_8_;
      local_2080._40_8_ = auVar74._40_8_;
      uStack_1dd8 = local_2080._40_8_;
      local_2080._48_8_ = auVar74._48_8_;
      uStack_1dd0 = local_2080._48_8_;
      local_2080._56_8_ = auVar74._56_8_;
      uStack_1dc8 = local_2080._56_8_;
      local_1e40[0] = -88.37626;
      local_1e40[1] = -88.37626;
      afStack_1e38[0] = -88.37626;
      afStack_1e38[1] = -88.37626;
      afStack_1e30[0] = -88.37626;
      afStack_1e30[1] = -88.37626;
      afStack_1e28[0] = -88.37626;
      afStack_1e28[1] = -88.37626;
      afStack_1e20[0] = -88.37626;
      afStack_1e20[1] = -88.37626;
      afStack_1e18[0] = -88.37626;
      afStack_1e18[1] = -88.37626;
      afStack_1e10[0] = -88.37626;
      afStack_1e10[1] = -88.37626;
      afStack_1e08[0] = -88.37626;
      afStack_1e08[1] = -88.37626;
      auVar73._8_4_ = -88.37626;
      auVar73._12_4_ = -88.37626;
      auVar73._0_4_ = -88.37626;
      auVar73._4_4_ = -88.37626;
      auVar73._16_4_ = -88.37626;
      auVar73._20_4_ = -88.37626;
      auVar73._24_4_ = -88.37626;
      auVar73._28_4_ = -88.37626;
      auVar73._32_4_ = -88.37626;
      auVar73._36_4_ = -88.37626;
      auVar73._40_4_ = -88.37626;
      auVar73._44_4_ = -88.37626;
      auVar73._48_4_ = -88.37626;
      auVar73._52_4_ = -88.37626;
      auVar73._56_4_ = -88.37626;
      auVar73._60_4_ = -88.37626;
      auVar74 = vmaxps_avx512f(auVar74,auVar73);
      local_2080._0_8_ = auVar74._0_8_;
      local_18c0 = local_2080._0_8_;
      local_2080._8_8_ = auVar74._8_8_;
      uStack_18b8 = local_2080._8_8_;
      local_2080._16_8_ = auVar74._16_8_;
      uStack_18b0 = local_2080._16_8_;
      local_2080._24_8_ = auVar74._24_8_;
      uStack_18a8 = local_2080._24_8_;
      local_2080._32_8_ = auVar74._32_8_;
      uStack_18a0 = local_2080._32_8_;
      local_2080._40_8_ = auVar74._40_8_;
      uStack_1898 = local_2080._40_8_;
      local_2080._48_8_ = auVar74._48_8_;
      uStack_1890 = local_2080._48_8_;
      local_2080._56_8_ = auVar74._56_8_;
      uStack_1888 = local_2080._56_8_;
      local_1900[0] = 1.442695;
      local_1900[1] = 1.442695;
      afStack_18f8[0] = 1.442695;
      afStack_18f8[1] = 1.442695;
      afStack_18f0[0] = 1.442695;
      afStack_18f0[1] = 1.442695;
      afStack_18e8[0] = 1.442695;
      afStack_18e8[1] = 1.442695;
      afStack_18e0[0] = 1.442695;
      afStack_18e0[1] = 1.442695;
      afStack_18d8[0] = 1.442695;
      afStack_18d8[1] = 1.442695;
      afStack_18d0[0] = 1.442695;
      afStack_18d0[1] = 1.442695;
      afStack_18c8[0] = 1.442695;
      afStack_18c8[1] = 1.442695;
      local_1940[0] = 0.5;
      local_1940[1] = 0.5;
      afStack_1938[0] = 0.5;
      afStack_1938[1] = 0.5;
      afStack_1930[0] = 0.5;
      afStack_1930[1] = 0.5;
      afStack_1928[0] = 0.5;
      afStack_1928[1] = 0.5;
      afStack_1920[0] = 0.5;
      afStack_1920[1] = 0.5;
      afStack_1918[0] = 0.5;
      afStack_1918[1] = 0.5;
      afStack_1910[0] = 0.5;
      afStack_1910[1] = 0.5;
      afStack_1908[0] = 0.5;
      afStack_1908[1] = 0.5;
      auVar31._8_4_ = 1.442695;
      auVar31._12_4_ = 1.442695;
      auVar31._0_4_ = 1.442695;
      auVar31._4_4_ = 1.442695;
      auVar31._16_4_ = 1.442695;
      auVar31._20_4_ = 1.442695;
      auVar31._24_4_ = 1.442695;
      auVar31._28_4_ = 1.442695;
      auVar31._32_4_ = 1.442695;
      auVar31._36_4_ = 1.442695;
      auVar31._40_4_ = 1.442695;
      auVar31._44_4_ = 1.442695;
      auVar31._48_4_ = 1.442695;
      auVar31._52_4_ = 1.442695;
      auVar31._56_4_ = 1.442695;
      auVar31._60_4_ = 1.442695;
      auVar30._8_4_ = 0.5;
      auVar30._12_4_ = 0.5;
      auVar30._0_4_ = 0.5;
      auVar30._4_4_ = 0.5;
      auVar30._16_4_ = 0.5;
      auVar30._20_4_ = 0.5;
      auVar30._24_4_ = 0.5;
      auVar30._28_4_ = 0.5;
      auVar30._32_4_ = 0.5;
      auVar30._36_4_ = 0.5;
      auVar30._40_4_ = 0.5;
      auVar30._44_4_ = 0.5;
      auVar30._48_4_ = 0.5;
      auVar30._52_4_ = 0.5;
      auVar30._56_4_ = 0.5;
      auVar30._60_4_ = 0.5;
      auVar73 = vfmadd213ps_avx512f(auVar31,auVar74,auVar30);
      auVar75 = vrndscaleps_avx512f(auVar73,1);
      uVar22 = vcmpps_avx512f(auVar73,auVar75,1);
      local_2182 = (ushort)uVar22;
      local_20c0._0_8_ = auVar75._0_8_;
      local_1840 = local_20c0._0_8_;
      local_20c0._8_8_ = auVar75._8_8_;
      uStack_1838 = local_20c0._8_8_;
      local_20c0._16_8_ = auVar75._16_8_;
      uStack_1830 = local_20c0._16_8_;
      local_20c0._24_8_ = auVar75._24_8_;
      uStack_1828 = local_20c0._24_8_;
      local_20c0._32_8_ = auVar75._32_8_;
      uStack_1820 = local_20c0._32_8_;
      local_20c0._40_8_ = auVar75._40_8_;
      uStack_1818 = local_20c0._40_8_;
      local_20c0._48_8_ = auVar75._48_8_;
      uStack_1810 = local_20c0._48_8_;
      local_20c0._56_8_ = auVar75._56_8_;
      uStack_1808 = local_20c0._56_8_;
      local_1880[0] = 1.0;
      local_1880[1] = 1.0;
      afStack_1878[0] = 1.0;
      afStack_1878[1] = 1.0;
      afStack_1870[0] = 1.0;
      afStack_1870[1] = 1.0;
      afStack_1868[0] = 1.0;
      afStack_1868[1] = 1.0;
      afStack_1860[0] = 1.0;
      afStack_1860[1] = 1.0;
      afStack_1858[0] = 1.0;
      afStack_1858[1] = 1.0;
      afStack_1850[0] = 1.0;
      afStack_1850[1] = 1.0;
      afStack_1848[0] = 1.0;
      afStack_1848[1] = 1.0;
      local_1740 = local_20c0._0_8_;
      uStack_1738 = local_20c0._8_8_;
      uStack_1730 = local_20c0._16_8_;
      uStack_1728 = local_20c0._24_8_;
      uStack_1720 = local_20c0._32_8_;
      uStack_1718 = local_20c0._40_8_;
      uStack_1710 = local_20c0._48_8_;
      uStack_1708 = local_20c0._56_8_;
      local_1780[0] = 1.0;
      local_1780[1] = 1.0;
      afStack_1778[0] = 1.0;
      afStack_1778[1] = 1.0;
      afStack_1770[0] = 1.0;
      afStack_1770[1] = 1.0;
      afStack_1768[0] = 1.0;
      afStack_1768[1] = 1.0;
      afStack_1760[0] = 1.0;
      afStack_1760[1] = 1.0;
      afStack_1758[0] = 1.0;
      afStack_1758[1] = 1.0;
      afStack_1750[0] = 1.0;
      afStack_1750[1] = 1.0;
      afStack_1748[0] = 1.0;
      afStack_1748[1] = 1.0;
      auVar32._8_4_ = 1.0;
      auVar32._12_4_ = 1.0;
      auVar32._0_4_ = 1.0;
      auVar32._4_4_ = 1.0;
      auVar32._16_4_ = 1.0;
      auVar32._20_4_ = 1.0;
      auVar32._24_4_ = 1.0;
      auVar32._28_4_ = 1.0;
      auVar32._32_4_ = 1.0;
      auVar32._36_4_ = 1.0;
      auVar32._40_4_ = 1.0;
      auVar32._44_4_ = 1.0;
      auVar32._48_4_ = 1.0;
      auVar32._52_4_ = 1.0;
      auVar32._56_4_ = 1.0;
      auVar32._60_4_ = 1.0;
      local_17c0._0_4_ = auVar75._0_4_;
      local_17c0._4_4_ = auVar75._4_4_;
      uStack_17b8._0_4_ = auVar75._8_4_;
      uStack_17b8._4_4_ = auVar75._12_4_;
      uStack_17b0._0_4_ = auVar75._16_4_;
      uStack_17b0._4_4_ = auVar75._20_4_;
      uStack_17a8._0_4_ = auVar75._24_4_;
      uStack_17a8._4_4_ = auVar75._28_4_;
      uStack_17a0._0_4_ = auVar75._32_4_;
      uStack_17a0._4_4_ = auVar75._36_4_;
      uStack_1798._0_4_ = auVar75._40_4_;
      uStack_1798._4_4_ = auVar75._44_4_;
      uStack_1790._0_4_ = auVar75._48_4_;
      uStack_1790._4_4_ = auVar75._52_4_;
      uStack_1788._0_4_ = auVar75._56_4_;
      uStack_1788._4_4_ = auVar75._60_4_;
      auVar73 = vsubps_avx512f(auVar75,auVar32);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_2182 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2182 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2182 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2182 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2182 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2182 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2182 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2100._4_4_ = (uint)bVar2 * auVar73._4_4_ | (uint)!bVar2 * local_17c0._4_4_;
      local_2100._0_4_ = (uint)bVar1 * auVar73._0_4_ | (uint)!bVar1 * (int)local_17c0;
      local_2100._8_4_ = (uint)bVar3 * auVar73._8_4_ | (uint)!bVar3 * (int)uStack_17b8;
      local_2100._12_4_ = (uint)bVar4 * auVar73._12_4_ | (uint)!bVar4 * uStack_17b8._4_4_;
      uStack_20f0._0_4_ = (uint)bVar5 * auVar73._16_4_ | (uint)!bVar5 * (int)uStack_17b0;
      uStack_20f0._4_4_ = (uint)bVar6 * auVar73._20_4_ | (uint)!bVar6 * uStack_17b0._4_4_;
      auVar68 = _local_2100;
      uStack_20e8._0_4_ = (uint)bVar7 * auVar73._24_4_ | (uint)!bVar7 * (int)uStack_17a8;
      uStack_20e8._4_4_ = (uint)bVar8 * auVar73._28_4_ | (uint)!bVar8 * uStack_17a8._4_4_;
      auVar21 = _local_2100;
      uStack_20e0._0_4_ =
           (uint)(bVar9 & 1) * auVar73._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_17a0;
      uStack_20e0._4_4_ = (uint)bVar10 * auVar73._36_4_ | (uint)!bVar10 * uStack_17a0._4_4_;
      auVar69 = _local_2100;
      uStack_20d8._0_4_ = (uint)bVar11 * auVar73._40_4_ | (uint)!bVar11 * (int)uStack_1798;
      uStack_20d8._4_4_ = (uint)bVar12 * auVar73._44_4_ | (uint)!bVar12 * uStack_1798._4_4_;
      auVar70 = _local_2100;
      uStack_20d0._0_4_ = (uint)bVar13 * auVar73._48_4_ | (uint)!bVar13 * (int)uStack_1790;
      uStack_20d0._4_4_ = (uint)bVar14 * auVar73._52_4_ | (uint)!bVar14 * uStack_1790._4_4_;
      auVar71 = _local_2100;
      uStack_20c8._0_4_ = (uint)bVar15 * auVar73._56_4_ | (uint)!bVar15 * (int)uStack_1788;
      uStack_20c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar73._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1788._4_4_;
      auVar73 = _local_2100;
      local_15c0 = local_2100._0_8_;
      uStack_15b8 = local_2100._8_8_;
      uStack_20f0 = auVar68._16_8_;
      uStack_15b0 = uStack_20f0;
      uStack_20e8 = auVar21._24_8_;
      uStack_15a8 = uStack_20e8;
      uStack_20e0 = auVar69._32_8_;
      uStack_15a0 = uStack_20e0;
      uStack_20d8 = auVar70._40_8_;
      uStack_1598 = uStack_20d8;
      uStack_20d0 = auVar71._48_8_;
      uStack_1590 = uStack_20d0;
      uStack_20c8 = auVar73._56_8_;
      uStack_1588 = uStack_20c8;
      local_1600[0] = 0.6933594;
      local_1600[1] = 0.6933594;
      afStack_15f8[0] = 0.6933594;
      afStack_15f8[1] = 0.6933594;
      afStack_15f0[0] = 0.6933594;
      afStack_15f0[1] = 0.6933594;
      afStack_15e8[0] = 0.6933594;
      afStack_15e8[1] = 0.6933594;
      afStack_15e0[0] = 0.6933594;
      afStack_15e0[1] = 0.6933594;
      afStack_15d8[0] = 0.6933594;
      afStack_15d8[1] = 0.6933594;
      afStack_15d0[0] = 0.6933594;
      afStack_15d0[1] = 0.6933594;
      afStack_15c8[0] = 0.6933594;
      afStack_15c8[1] = 0.6933594;
      local_1640 = local_2080._0_8_;
      uStack_1638 = local_2080._8_8_;
      uStack_1630 = local_2080._16_8_;
      uStack_1628 = local_2080._24_8_;
      uStack_1620 = local_2080._32_8_;
      uStack_1618 = local_2080._40_8_;
      uStack_1610 = local_2080._48_8_;
      uStack_1608 = local_2080._56_8_;
      auVar36._16_8_ = uStack_20f0;
      auVar36._0_16_ = local_2100;
      auVar36._24_8_ = uStack_20e8;
      auVar36._32_8_ = uStack_20e0;
      auVar36._40_8_ = uStack_20d8;
      auVar36._48_8_ = uStack_20d0;
      auVar36._56_8_ = uStack_20c8;
      auVar35._8_4_ = 0.6933594;
      auVar35._12_4_ = 0.6933594;
      auVar35._0_4_ = 0.6933594;
      auVar35._4_4_ = 0.6933594;
      auVar35._16_4_ = 0.6933594;
      auVar35._20_4_ = 0.6933594;
      auVar35._24_4_ = 0.6933594;
      auVar35._28_4_ = 0.6933594;
      auVar35._32_4_ = 0.6933594;
      auVar35._36_4_ = 0.6933594;
      auVar35._40_4_ = 0.6933594;
      auVar35._44_4_ = 0.6933594;
      auVar35._48_4_ = 0.6933594;
      auVar35._52_4_ = 0.6933594;
      auVar35._56_4_ = 0.6933594;
      auVar35._60_4_ = 0.6933594;
      auVar74 = vfnmadd213ps_avx512f(auVar35,auVar36,auVar74);
      local_1680 = local_2100._0_8_;
      uStack_1678 = local_2100._8_8_;
      uStack_1670 = uStack_20f0;
      uStack_1668 = uStack_20e8;
      uStack_1660 = uStack_20e0;
      uStack_1658 = uStack_20d8;
      uStack_1650 = uStack_20d0;
      uStack_1648 = uStack_20c8;
      local_16c0[0] = -0.00021219444;
      local_16c0[1] = -0.00021219444;
      afStack_16b8[0] = -0.00021219444;
      afStack_16b8[1] = -0.00021219444;
      afStack_16b0[0] = -0.00021219444;
      afStack_16b0[1] = -0.00021219444;
      afStack_16a8[0] = -0.00021219444;
      afStack_16a8[1] = -0.00021219444;
      afStack_16a0[0] = -0.00021219444;
      afStack_16a0[1] = -0.00021219444;
      afStack_1698[0] = -0.00021219444;
      afStack_1698[1] = -0.00021219444;
      afStack_1690[0] = -0.00021219444;
      afStack_1690[1] = -0.00021219444;
      afStack_1688[0] = -0.00021219444;
      afStack_1688[1] = -0.00021219444;
      local_2080._0_8_ = auVar74._0_8_;
      local_1700 = local_2080._0_8_;
      local_2080._8_8_ = auVar74._8_8_;
      uStack_16f8 = local_2080._8_8_;
      local_2080._16_8_ = auVar74._16_8_;
      uStack_16f0 = local_2080._16_8_;
      local_2080._24_8_ = auVar74._24_8_;
      uStack_16e8 = local_2080._24_8_;
      local_2080._32_8_ = auVar74._32_8_;
      uStack_16e0 = local_2080._32_8_;
      local_2080._40_8_ = auVar74._40_8_;
      uStack_16d8 = local_2080._40_8_;
      local_2080._48_8_ = auVar74._48_8_;
      uStack_16d0 = local_2080._48_8_;
      local_2080._56_8_ = auVar74._56_8_;
      uStack_16c8 = local_2080._56_8_;
      auVar34._16_8_ = uStack_20f0;
      auVar34._0_16_ = local_2100;
      auVar34._24_8_ = uStack_20e8;
      auVar34._32_8_ = uStack_20e0;
      auVar34._40_8_ = uStack_20d8;
      auVar34._48_8_ = uStack_20d0;
      auVar34._56_8_ = uStack_20c8;
      auVar33._8_4_ = -0.00021219444;
      auVar33._12_4_ = -0.00021219444;
      auVar33._0_4_ = -0.00021219444;
      auVar33._4_4_ = -0.00021219444;
      auVar33._16_4_ = -0.00021219444;
      auVar33._20_4_ = -0.00021219444;
      auVar33._24_4_ = -0.00021219444;
      auVar33._28_4_ = -0.00021219444;
      auVar33._32_4_ = -0.00021219444;
      auVar33._36_4_ = -0.00021219444;
      auVar33._40_4_ = -0.00021219444;
      auVar33._44_4_ = -0.00021219444;
      auVar33._48_4_ = -0.00021219444;
      auVar33._52_4_ = -0.00021219444;
      auVar33._56_4_ = -0.00021219444;
      auVar33._60_4_ = -0.00021219444;
      local_2080 = vfnmadd213ps_avx512f(auVar33,auVar34,auVar74);
      local_1f40 = local_2080._0_8_;
      uStack_1f38 = local_2080._8_8_;
      uStack_1f30 = local_2080._16_8_;
      uStack_1f28 = local_2080._24_8_;
      uStack_1f20 = local_2080._32_8_;
      uStack_1f18 = local_2080._40_8_;
      uStack_1f10 = local_2080._48_8_;
      uStack_1f08 = local_2080._56_8_;
      local_20c0 = vmulps_avx512f(local_2080,local_2080);
      uStack_21f8._0_4_ = 0.00019875691;
      uStack_21f8._4_4_ = 0.00019875691;
      local_2200._0_4_ = 0.00019875691;
      local_2200._4_4_ = 0.00019875691;
      local_1980[0] = 0.00019875691;
      local_1980[1] = 0.00019875691;
      afStack_1978[0] = 0.00019875691;
      afStack_1978[1] = 0.00019875691;
      afStack_1970[0] = 0.00019875691;
      afStack_1970[1] = 0.00019875691;
      afStack_1968[0] = 0.00019875691;
      afStack_1968[1] = 0.00019875691;
      afStack_1960[0] = 0.00019875691;
      afStack_1960[1] = 0.00019875691;
      afStack_1958[0] = 0.00019875691;
      afStack_1958[1] = 0.00019875691;
      afStack_1950[0] = 0.00019875691;
      afStack_1950[1] = 0.00019875691;
      afStack_1948[0] = 0.00019875691;
      afStack_1948[1] = 0.00019875691;
      local_19c0 = local_2080._0_8_;
      uStack_19b8 = local_2080._8_8_;
      uStack_19b0 = local_2080._16_8_;
      uStack_19a8 = local_2080._24_8_;
      uStack_19a0 = local_2080._32_8_;
      uStack_1998 = local_2080._40_8_;
      uStack_1990 = local_2080._48_8_;
      uStack_1988 = local_2080._56_8_;
      local_1a00[0] = 0.0013981999;
      local_1a00[1] = 0.0013981999;
      afStack_19f8[0] = 0.0013981999;
      afStack_19f8[1] = 0.0013981999;
      afStack_19f0[0] = 0.0013981999;
      afStack_19f0[1] = 0.0013981999;
      afStack_19e8[0] = 0.0013981999;
      afStack_19e8[1] = 0.0013981999;
      afStack_19e0[0] = 0.0013981999;
      afStack_19e0[1] = 0.0013981999;
      afStack_19d8[0] = 0.0013981999;
      afStack_19d8[1] = 0.0013981999;
      afStack_19d0[0] = 0.0013981999;
      afStack_19d0[1] = 0.0013981999;
      afStack_19c8[0] = 0.0013981999;
      afStack_19c8[1] = 0.0013981999;
      auVar29._16_4_ = 0.00019875691;
      auVar29._20_4_ = 0.00019875691;
      auVar29._0_16_ = _local_2200;
      auVar29._24_4_ = 0.00019875691;
      auVar29._28_4_ = 0.00019875691;
      auVar29._32_4_ = 0.00019875691;
      auVar29._36_4_ = 0.00019875691;
      auVar29._40_4_ = 0.00019875691;
      auVar29._44_4_ = 0.00019875691;
      auVar29._48_4_ = 0.00019875691;
      auVar29._52_4_ = 0.00019875691;
      auVar29._56_4_ = 0.00019875691;
      auVar29._60_4_ = 0.00019875691;
      auVar28._8_4_ = 0.0013981999;
      auVar28._12_4_ = 0.0013981999;
      auVar28._0_4_ = 0.0013981999;
      auVar28._4_4_ = 0.0013981999;
      auVar28._16_4_ = 0.0013981999;
      auVar28._20_4_ = 0.0013981999;
      auVar28._24_4_ = 0.0013981999;
      auVar28._28_4_ = 0.0013981999;
      auVar28._32_4_ = 0.0013981999;
      auVar28._36_4_ = 0.0013981999;
      auVar28._40_4_ = 0.0013981999;
      auVar28._44_4_ = 0.0013981999;
      auVar28._48_4_ = 0.0013981999;
      auVar28._52_4_ = 0.0013981999;
      auVar28._56_4_ = 0.0013981999;
      auVar28._60_4_ = 0.0013981999;
      auVar74 = vfmadd213ps_avx512f(local_2080,auVar29,auVar28);
      local_2200 = auVar74._0_8_;
      local_1a40 = local_2200;
      uStack_21f8 = auVar74._8_8_;
      uStack_1a38 = uStack_21f8;
      uStack_21f0 = auVar74._16_8_;
      uStack_1a30 = uStack_21f0;
      uStack_21e8 = auVar74._24_8_;
      uStack_1a28 = uStack_21e8;
      uStack_21e0 = auVar74._32_8_;
      uStack_1a20 = uStack_21e0;
      uStack_21d8 = auVar74._40_8_;
      uStack_1a18 = uStack_21d8;
      uStack_21d0 = auVar74._48_8_;
      uStack_1a10 = uStack_21d0;
      uStack_21c8 = auVar74._56_8_;
      uStack_1a08 = uStack_21c8;
      local_1a80 = local_2080._0_8_;
      uStack_1a78 = local_2080._8_8_;
      uStack_1a70 = local_2080._16_8_;
      uStack_1a68 = local_2080._24_8_;
      uStack_1a60 = local_2080._32_8_;
      uStack_1a58 = local_2080._40_8_;
      uStack_1a50 = local_2080._48_8_;
      uStack_1a48 = local_2080._56_8_;
      local_1ac0[0] = 0.008333452;
      local_1ac0[1] = 0.008333452;
      afStack_1ab8[0] = 0.008333452;
      afStack_1ab8[1] = 0.008333452;
      afStack_1ab0[0] = 0.008333452;
      afStack_1ab0[1] = 0.008333452;
      afStack_1aa8[0] = 0.008333452;
      afStack_1aa8[1] = 0.008333452;
      afStack_1aa0[0] = 0.008333452;
      afStack_1aa0[1] = 0.008333452;
      afStack_1a98[0] = 0.008333452;
      afStack_1a98[1] = 0.008333452;
      afStack_1a90[0] = 0.008333452;
      afStack_1a90[1] = 0.008333452;
      afStack_1a88[0] = 0.008333452;
      afStack_1a88[1] = 0.008333452;
      auVar27._8_4_ = 0.008333452;
      auVar27._12_4_ = 0.008333452;
      auVar27._0_4_ = 0.008333452;
      auVar27._4_4_ = 0.008333452;
      auVar27._16_4_ = 0.008333452;
      auVar27._20_4_ = 0.008333452;
      auVar27._24_4_ = 0.008333452;
      auVar27._28_4_ = 0.008333452;
      auVar27._32_4_ = 0.008333452;
      auVar27._36_4_ = 0.008333452;
      auVar27._40_4_ = 0.008333452;
      auVar27._44_4_ = 0.008333452;
      auVar27._48_4_ = 0.008333452;
      auVar27._52_4_ = 0.008333452;
      auVar27._56_4_ = 0.008333452;
      auVar27._60_4_ = 0.008333452;
      auVar74 = vfmadd213ps_avx512f(local_2080,auVar74,auVar27);
      local_2200 = auVar74._0_8_;
      local_1b00 = local_2200;
      uStack_21f8 = auVar74._8_8_;
      uStack_1af8 = uStack_21f8;
      uStack_21f0 = auVar74._16_8_;
      uStack_1af0 = uStack_21f0;
      uStack_21e8 = auVar74._24_8_;
      uStack_1ae8 = uStack_21e8;
      uStack_21e0 = auVar74._32_8_;
      uStack_1ae0 = uStack_21e0;
      uStack_21d8 = auVar74._40_8_;
      uStack_1ad8 = uStack_21d8;
      uStack_21d0 = auVar74._48_8_;
      uStack_1ad0 = uStack_21d0;
      uStack_21c8 = auVar74._56_8_;
      uStack_1ac8 = uStack_21c8;
      local_1b40 = local_2080._0_8_;
      uStack_1b38 = local_2080._8_8_;
      uStack_1b30 = local_2080._16_8_;
      uStack_1b28 = local_2080._24_8_;
      uStack_1b20 = local_2080._32_8_;
      uStack_1b18 = local_2080._40_8_;
      uStack_1b10 = local_2080._48_8_;
      uStack_1b08 = local_2080._56_8_;
      local_1b80[0] = 0.041665796;
      local_1b80[1] = 0.041665796;
      afStack_1b78[0] = 0.041665796;
      afStack_1b78[1] = 0.041665796;
      afStack_1b70[0] = 0.041665796;
      afStack_1b70[1] = 0.041665796;
      afStack_1b68[0] = 0.041665796;
      afStack_1b68[1] = 0.041665796;
      afStack_1b60[0] = 0.041665796;
      afStack_1b60[1] = 0.041665796;
      afStack_1b58[0] = 0.041665796;
      afStack_1b58[1] = 0.041665796;
      afStack_1b50[0] = 0.041665796;
      afStack_1b50[1] = 0.041665796;
      afStack_1b48[0] = 0.041665796;
      afStack_1b48[1] = 0.041665796;
      auVar26._8_4_ = 0.041665796;
      auVar26._12_4_ = 0.041665796;
      auVar26._0_4_ = 0.041665796;
      auVar26._4_4_ = 0.041665796;
      auVar26._16_4_ = 0.041665796;
      auVar26._20_4_ = 0.041665796;
      auVar26._24_4_ = 0.041665796;
      auVar26._28_4_ = 0.041665796;
      auVar26._32_4_ = 0.041665796;
      auVar26._36_4_ = 0.041665796;
      auVar26._40_4_ = 0.041665796;
      auVar26._44_4_ = 0.041665796;
      auVar26._48_4_ = 0.041665796;
      auVar26._52_4_ = 0.041665796;
      auVar26._56_4_ = 0.041665796;
      auVar26._60_4_ = 0.041665796;
      auVar74 = vfmadd213ps_avx512f(local_2080,auVar74,auVar26);
      local_2200 = auVar74._0_8_;
      local_1bc0 = local_2200;
      uStack_21f8 = auVar74._8_8_;
      uStack_1bb8 = uStack_21f8;
      uStack_21f0 = auVar74._16_8_;
      uStack_1bb0 = uStack_21f0;
      uStack_21e8 = auVar74._24_8_;
      uStack_1ba8 = uStack_21e8;
      uStack_21e0 = auVar74._32_8_;
      uStack_1ba0 = uStack_21e0;
      uStack_21d8 = auVar74._40_8_;
      uStack_1b98 = uStack_21d8;
      uStack_21d0 = auVar74._48_8_;
      uStack_1b90 = uStack_21d0;
      uStack_21c8 = auVar74._56_8_;
      uStack_1b88 = uStack_21c8;
      local_1c00 = local_2080._0_8_;
      uStack_1bf8 = local_2080._8_8_;
      uStack_1bf0 = local_2080._16_8_;
      uStack_1be8 = local_2080._24_8_;
      uStack_1be0 = local_2080._32_8_;
      uStack_1bd8 = local_2080._40_8_;
      uStack_1bd0 = local_2080._48_8_;
      uStack_1bc8 = local_2080._56_8_;
      local_1c40[0] = 0.16666666;
      local_1c40[1] = 0.16666666;
      afStack_1c38[0] = 0.16666666;
      afStack_1c38[1] = 0.16666666;
      afStack_1c30[0] = 0.16666666;
      afStack_1c30[1] = 0.16666666;
      afStack_1c28[0] = 0.16666666;
      afStack_1c28[1] = 0.16666666;
      afStack_1c20[0] = 0.16666666;
      afStack_1c20[1] = 0.16666666;
      afStack_1c18[0] = 0.16666666;
      afStack_1c18[1] = 0.16666666;
      afStack_1c10[0] = 0.16666666;
      afStack_1c10[1] = 0.16666666;
      afStack_1c08[0] = 0.16666666;
      afStack_1c08[1] = 0.16666666;
      auVar76._8_4_ = 0.16666666;
      auVar76._12_4_ = 0.16666666;
      auVar76._0_4_ = 0.16666666;
      auVar76._4_4_ = 0.16666666;
      auVar76._16_4_ = 0.16666666;
      auVar76._20_4_ = 0.16666666;
      auVar76._24_4_ = 0.16666666;
      auVar76._28_4_ = 0.16666666;
      auVar76._32_4_ = 0.16666666;
      auVar76._36_4_ = 0.16666666;
      auVar76._40_4_ = 0.16666666;
      auVar76._44_4_ = 0.16666666;
      auVar76._48_4_ = 0.16666666;
      auVar76._52_4_ = 0.16666666;
      auVar76._56_4_ = 0.16666666;
      auVar76._60_4_ = 0.16666666;
      auVar74 = vfmadd213ps_avx512f(local_2080,auVar74,auVar76);
      local_2200 = auVar74._0_8_;
      local_1c80 = local_2200;
      uStack_21f8 = auVar74._8_8_;
      uStack_1c78 = uStack_21f8;
      uStack_21f0 = auVar74._16_8_;
      uStack_1c70 = uStack_21f0;
      uStack_21e8 = auVar74._24_8_;
      uStack_1c68 = uStack_21e8;
      uStack_21e0 = auVar74._32_8_;
      uStack_1c60 = uStack_21e0;
      uStack_21d8 = auVar74._40_8_;
      uStack_1c58 = uStack_21d8;
      uStack_21d0 = auVar74._48_8_;
      uStack_1c50 = uStack_21d0;
      uStack_21c8 = auVar74._56_8_;
      uStack_1c48 = uStack_21c8;
      local_1cc0 = local_2080._0_8_;
      uStack_1cb8 = local_2080._8_8_;
      uStack_1cb0 = local_2080._16_8_;
      uStack_1ca8 = local_2080._24_8_;
      uStack_1ca0 = local_2080._32_8_;
      uStack_1c98 = local_2080._40_8_;
      uStack_1c90 = local_2080._48_8_;
      uStack_1c88 = local_2080._56_8_;
      local_1d00[0] = 0.5;
      local_1d00[1] = 0.5;
      afStack_1cf8[0] = 0.5;
      afStack_1cf8[1] = 0.5;
      afStack_1cf0[0] = 0.5;
      afStack_1cf0[1] = 0.5;
      afStack_1ce8[0] = 0.5;
      afStack_1ce8[1] = 0.5;
      afStack_1ce0[0] = 0.5;
      afStack_1ce0[1] = 0.5;
      afStack_1cd8[0] = 0.5;
      afStack_1cd8[1] = 0.5;
      afStack_1cd0[0] = 0.5;
      afStack_1cd0[1] = 0.5;
      afStack_1cc8[0] = 0.5;
      afStack_1cc8[1] = 0.5;
      auVar75._8_4_ = 0.5;
      auVar75._12_4_ = 0.5;
      auVar75._0_4_ = 0.5;
      auVar75._4_4_ = 0.5;
      auVar75._16_4_ = 0.5;
      auVar75._20_4_ = 0.5;
      auVar75._24_4_ = 0.5;
      auVar75._28_4_ = 0.5;
      auVar75._32_4_ = 0.5;
      auVar75._36_4_ = 0.5;
      auVar75._40_4_ = 0.5;
      auVar75._44_4_ = 0.5;
      auVar75._48_4_ = 0.5;
      auVar75._52_4_ = 0.5;
      auVar75._56_4_ = 0.5;
      auVar75._60_4_ = 0.5;
      auVar74 = vfmadd213ps_avx512f(local_2080,auVar74,auVar75);
      local_2200 = auVar74._0_8_;
      local_1d40 = local_2200;
      uStack_21f8 = auVar74._8_8_;
      uStack_1d38 = uStack_21f8;
      uStack_21f0 = auVar74._16_8_;
      uStack_1d30 = uStack_21f0;
      uStack_21e8 = auVar74._24_8_;
      uStack_1d28 = uStack_21e8;
      uStack_21e0 = auVar74._32_8_;
      uStack_1d20 = uStack_21e0;
      uStack_21d8 = auVar74._40_8_;
      uStack_1d18 = uStack_21d8;
      uStack_21d0 = auVar74._48_8_;
      uStack_1d10 = uStack_21d0;
      uStack_21c8 = auVar74._56_8_;
      uStack_1d08 = uStack_21c8;
      local_1d80 = local_20c0._0_8_;
      uStack_1d78 = local_20c0._8_8_;
      uStack_1d70 = local_20c0._16_8_;
      uStack_1d68 = local_20c0._24_8_;
      uStack_1d60 = local_20c0._32_8_;
      uStack_1d58 = local_20c0._40_8_;
      uStack_1d50 = local_20c0._48_8_;
      uStack_1d48 = local_20c0._56_8_;
      local_1dc0 = local_2080._0_8_;
      uStack_1db8 = local_2080._8_8_;
      uStack_1db0 = local_2080._16_8_;
      uStack_1da8 = local_2080._24_8_;
      uStack_1da0 = local_2080._32_8_;
      uStack_1d98 = local_2080._40_8_;
      uStack_1d90 = local_2080._48_8_;
      uStack_1d88 = local_2080._56_8_;
      auVar74 = vfmadd213ps_avx512f(local_20c0,auVar74,local_2080);
      local_2200 = auVar74._0_8_;
      local_1540 = local_2200;
      uStack_21f8 = auVar74._8_8_;
      uStack_1538 = uStack_21f8;
      uStack_21f0 = auVar74._16_8_;
      uStack_1530 = uStack_21f0;
      uStack_21e8 = auVar74._24_8_;
      uStack_1528 = uStack_21e8;
      uStack_21e0 = auVar74._32_8_;
      uStack_1520 = uStack_21e0;
      uStack_21d8 = auVar74._40_8_;
      uStack_1518 = uStack_21d8;
      uStack_21d0 = auVar74._48_8_;
      uStack_1510 = uStack_21d0;
      uStack_21c8 = auVar74._56_8_;
      uStack_1508 = uStack_21c8;
      local_1580[0] = 1.0;
      local_1580[1] = 1.0;
      afStack_1578[0] = 1.0;
      afStack_1578[1] = 1.0;
      afStack_1570[0] = 1.0;
      afStack_1570[1] = 1.0;
      afStack_1568[0] = 1.0;
      afStack_1568[1] = 1.0;
      afStack_1560[0] = 1.0;
      afStack_1560[1] = 1.0;
      afStack_1558[0] = 1.0;
      afStack_1558[1] = 1.0;
      afStack_1550[0] = 1.0;
      afStack_1550[1] = 1.0;
      afStack_1548[0] = 1.0;
      afStack_1548[1] = 1.0;
      auVar37._8_4_ = 1.0;
      auVar37._12_4_ = 1.0;
      auVar37._0_4_ = 1.0;
      auVar37._4_4_ = 1.0;
      auVar37._16_4_ = 1.0;
      auVar37._20_4_ = 1.0;
      auVar37._24_4_ = 1.0;
      auVar37._28_4_ = 1.0;
      auVar37._32_4_ = 1.0;
      auVar37._36_4_ = 1.0;
      auVar37._40_4_ = 1.0;
      auVar37._44_4_ = 1.0;
      auVar37._48_4_ = 1.0;
      auVar37._52_4_ = 1.0;
      auVar37._56_4_ = 1.0;
      auVar37._60_4_ = 1.0;
      auVar75 = vaddps_avx512f(auVar74,auVar37);
      local_1480 = local_2100._0_8_;
      uStack_1478 = local_2100._8_8_;
      uStack_1470 = uStack_20f0;
      uStack_1468 = uStack_20e8;
      uStack_1460 = uStack_20e0;
      uStack_1458 = uStack_20d8;
      uStack_1450 = uStack_20d0;
      uStack_1448 = uStack_20c8;
      auVar38._16_8_ = uStack_20f0;
      auVar38._0_16_ = local_2100;
      auVar38._24_8_ = uStack_20e8;
      auVar38._32_8_ = uStack_20e0;
      auVar38._40_8_ = uStack_20d8;
      auVar38._48_8_ = uStack_20d0;
      auVar38._56_8_ = uStack_20c8;
      auVar74 = vcvttps2dq_avx512f(auVar38);
      local_1340 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar76 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_1400 = vmovdqa64_avx512f(auVar74);
      local_1440 = vmovdqa64_avx512f(auVar76);
      auVar74 = vmovdqa64_avx512f(local_1400);
      auVar76 = vmovdqa64_avx512f(local_1440);
      auVar74 = vpaddd_avx512f(auVar74,auVar76);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(auVar74);
      local_1380 = vmovdqa64_avx512f(auVar74);
      local_1384 = 0x17;
      auVar74 = vmovdqa64_avx512f(local_1380);
      auVar74 = vpslld_avx512f(auVar74,ZEXT416(0x17));
      local_2140 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(local_2140);
      local_2040 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(local_2040);
      local_2240 = vmovdqa64_avx512f(auVar74);
      local_2200 = auVar75._0_8_;
      local_1f80 = local_2200;
      uStack_21f8 = auVar75._8_8_;
      uStack_1f78 = uStack_21f8;
      uStack_21f0 = auVar75._16_8_;
      uStack_1f70 = uStack_21f0;
      uStack_21e8 = auVar75._24_8_;
      uStack_1f68 = uStack_21e8;
      uStack_21e0 = auVar75._32_8_;
      uStack_1f60 = uStack_21e0;
      uStack_21d8 = auVar75._40_8_;
      uStack_1f58 = uStack_21d8;
      uStack_21d0 = auVar75._48_8_;
      uStack_1f50 = uStack_21d0;
      uStack_21c8 = auVar75._56_8_;
      uStack_1f48 = uStack_21c8;
      local_1fc0 = local_2240._0_8_;
      uStack_1fb8 = local_2240._8_8_;
      uStack_1fb0 = local_2240._16_8_;
      uStack_1fa8 = local_2240._24_8_;
      uStack_1fa0 = local_2240._32_8_;
      uStack_1f98 = local_2240._40_8_;
      uStack_1f90 = local_2240._48_8_;
      uStack_1f88 = local_2240._56_8_;
      _local_2200 = vmulps_avx512f(auVar75,local_2240);
      local_1500 = local_2200;
      uStack_14f8 = uStack_21f8;
      uStack_14f0 = uStack_21f0;
      uStack_14e8 = uStack_21e8;
      uStack_14e0 = uStack_21e0;
      uStack_14d8 = uStack_21d8;
      uStack_14d0 = uStack_21d0;
      uStack_14c8 = uStack_21c8;
      local_1280 = vaddps_avx512f(local_1300,_local_2200);
      local_23c0 = vdivps_avx512f(local_1300,local_1280);
      local_2400 = local_2540._0_8_;
      uStack_23f8 = local_2540._8_8_;
      uStack_23f0 = local_2540._16_8_;
      uStack_23e8 = local_2540._24_8_;
      uStack_23e0 = local_2540._32_8_;
      uStack_23d8 = local_2540._40_8_;
      uStack_23d0 = local_2540._48_8_;
      uStack_23c8 = local_2540._56_8_;
      local_2440 = local_24c0._0_8_;
      uStack_2438 = local_24c0._8_8_;
      uStack_2430 = local_24c0._16_8_;
      uStack_2428 = local_24c0._24_8_;
      uStack_2420 = local_24c0._32_8_;
      uStack_2418 = local_24c0._40_8_;
      uStack_2410 = local_24c0._48_8_;
      uStack_2408 = local_24c0._56_8_;
      auVar74 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar74 = vpxord_avx512f(local_24c0,auVar74);
      local_2900 = vfmadd213ps_avx512f(local_2540,local_23c0,auVar74);
      local_2790 = local_2870;
      local_2800 = local_2900._0_8_;
      uStack_27f8 = local_2900._8_8_;
      uStack_27f0 = local_2900._16_8_;
      uStack_27e8 = local_2900._24_8_;
      uStack_27e0 = local_2900._32_8_;
      uStack_27d8 = local_2900._40_8_;
      uStack_27d0 = local_2900._48_8_;
      uStack_27c8 = local_2900._56_8_;
      *local_2870 = local_2900;
      local_2870 = local_2870 + 1;
      local_2580 = local_2600;
      uStack_2578 = uStack_25f8;
      uStack_2570 = uStack_25f0;
      uStack_2568 = uStack_25e8;
      uStack_2560 = uStack_25e0;
      uStack_2558 = uStack_25d8;
      uStack_2550 = uStack_25d0;
      uStack_2548 = uStack_25c8;
      _local_2100 = auVar73;
      local_1f00 = local_1f40;
      uStack_1ef8 = uStack_1f38;
      uStack_1ef0 = uStack_1f30;
      uStack_1ee8 = uStack_1f28;
      uStack_1ee0 = uStack_1f20;
      uStack_1ed8 = uStack_1f18;
      uStack_1ed0 = uStack_1f10;
      uStack_1ec8 = uStack_1f08;
      local_17c2 = local_2182;
      local_17c0 = local_1840;
      uStack_17b8 = uStack_1838;
      uStack_17b0 = uStack_1830;
      uStack_17a8 = uStack_1828;
      uStack_17a0 = uStack_1820;
      uStack_1798 = uStack_1818;
      uStack_1790 = uStack_1810;
      uStack_1788 = uStack_1808;
      local_1240 = local_14c0;
      uStack_1238 = uStack_14b8;
      uStack_1230 = uStack_14b0;
      uStack_1228 = uStack_14a8;
      uStack_1220 = uStack_14a0;
      uStack_1218 = uStack_1498;
      uStack_1210 = uStack_1490;
      uStack_1208 = uStack_1488;
    }
    for (; local_28bc + 7 < local_2864; local_28bc = local_28bc + 8) {
      local_2788 = local_2870;
      auVar21 = *(undefined1 (*) [32])*local_2870;
      local_26a8 = local_2849;
      local_26b0 = local_2920;
      local_2920._0_8_ = auVar21._0_8_;
      local_11a0 = local_2920._0_8_;
      local_2920._8_8_ = auVar21._8_8_;
      uStack_1198 = local_2920._8_8_;
      local_2920._16_8_ = auVar21._16_8_;
      uStack_1190 = local_2920._16_8_;
      local_2920._24_8_ = auVar21._24_8_;
      uStack_1188 = local_2920._24_8_;
      local_1124 = 0x3f800000;
      local_1100 = 0x3f800000;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      local_1120 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auStack_1110 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      local_11c0 = local_1120._0_8_;
      uStack_11b8 = local_1120._8_8_;
      uStack_11b0 = auStack_1110._0_8_;
      uStack_11a8 = auStack_1110._8_8_;
      local_1128 = 0x40000000;
      local_10c0 = 0x40000000;
      auVar17 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x20);
      local_10e0 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x20);
      auStack_10d0 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x30);
      local_11e0 = local_10e0._0_8_;
      uStack_11d8 = local_10e0._8_8_;
      uStack_11d0 = auStack_10d0._0_8_;
      uStack_11c8 = auStack_10d0._8_8_;
      local_1160._0_4_ = auVar21._0_4_;
      local_1160._4_4_ = auVar21._4_4_;
      uStack_1158._0_4_ = auVar21._8_4_;
      uStack_1158._4_4_ = auVar21._12_4_;
      uStack_1150._0_4_ = auVar21._16_4_;
      uStack_1150._4_4_ = auVar21._20_4_;
      uStack_1148._0_4_ = auVar21._24_4_;
      uStack_1148._4_4_ = auVar21._28_4_;
      uStack_1004 = uStack_1148._4_4_;
      local_1180._0_4_ = local_10e0._0_4_;
      local_1180._4_4_ = local_10e0._4_4_;
      uStack_1178._0_4_ = local_10e0._8_4_;
      uStack_1178._4_4_ = local_10e0._12_4_;
      uStack_1170._0_4_ = auStack_10d0._0_4_;
      uStack_1170._4_4_ = auStack_10d0._4_4_;
      uStack_1168._0_4_ = auStack_10d0._8_4_;
      local_1020 = (float)local_1160 * (float)local_1180;
      fStack_101c = local_1160._4_4_ * local_1180._4_4_;
      fStack_1018 = (float)uStack_1158 * (float)uStack_1178;
      fStack_1014 = uStack_1158._4_4_ * uStack_1178._4_4_;
      fStack_1010 = (float)uStack_1150 * (float)uStack_1170;
      fStack_100c = uStack_1150._4_4_ * uStack_1170._4_4_;
      fStack_1008 = (float)uStack_1148 * (float)uStack_1168;
      local_6e4 = 0x3f800000;
      local_680 = 0x3f800000;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      local_6a0 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auStack_690 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      local_1040 = local_6a0._0_8_;
      uStack_1038 = local_6a0._8_8_;
      uStack_1030 = auStack_690._0_8_;
      uStack_1028 = auStack_690._8_8_;
      local_6c0 = local_6a0._0_8_;
      uStack_6b8 = local_6a0._8_8_;
      uStack_6b0 = auStack_690._0_8_;
      uStack_6a8 = auStack_690._8_8_;
      local_fc0 = 0;
      uStack_fb8 = 0;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      local_fe0 = 0;
      uStack_fd8 = 0;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      local_1000 = CONCAT44(fStack_101c,local_1020);
      uStack_ff8 = CONCAT44(fStack_1014,fStack_1018);
      uStack_ff0 = CONCAT44(fStack_100c,fStack_1010);
      uStack_fe8 = CONCAT44(uStack_1148._4_4_,fStack_1008);
      auVar20._8_8_ = uStack_ff8;
      auVar20._0_8_ = local_1000;
      auVar20._16_8_ = uStack_ff0;
      auVar20._24_8_ = uStack_fe8;
      auVar21 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar20);
      local_e00 = 0;
      uStack_df8 = 0;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_f40 = 0x3f800000;
      uStack_f3c = 0x3f800000;
      uStack_f38 = 0x3f800000;
      uStack_f34 = 0x3f800000;
      uStack_f30 = 0x3f800000;
      uStack_f2c = 0x3f800000;
      uStack_f28 = 0x3f800000;
      uStack_f24 = 0x3f800000;
      local_ec0._0_8_ = auVar21._0_8_;
      local_d40 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar21._8_8_;
      uStack_d38 = local_ec0._8_8_;
      local_ec0._16_8_ = auVar21._16_8_;
      uStack_d30 = local_ec0._16_8_;
      local_ec0._24_8_ = auVar21._24_8_;
      uStack_d28 = local_ec0._24_8_;
      local_d60 = 0x42b0c0a5;
      uStack_d5c = 0x42b0c0a5;
      uStack_d58 = 0x42b0c0a5;
      uStack_d54 = 0x42b0c0a5;
      uStack_d50 = 0x42b0c0a5;
      uStack_d4c = 0x42b0c0a5;
      uStack_d48 = 0x42b0c0a5;
      uStack_d44 = 0x42b0c0a5;
      auVar77._8_4_ = 0x42b0c0a5;
      auVar77._0_8_ = 0x42b0c0a542b0c0a5;
      auVar77._12_4_ = 0x42b0c0a5;
      auVar77._16_4_ = 0x42b0c0a5;
      auVar77._20_4_ = 0x42b0c0a5;
      auVar77._24_4_ = 0x42b0c0a5;
      auVar77._28_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar21,auVar77);
      local_ec0._0_8_ = auVar21._0_8_;
      local_d00 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar21._8_8_;
      uStack_cf8 = local_ec0._8_8_;
      local_ec0._16_8_ = auVar21._16_8_;
      uStack_cf0 = local_ec0._16_8_;
      local_ec0._24_8_ = auVar21._24_8_;
      uStack_ce8 = local_ec0._24_8_;
      local_d20 = 0xc2b0c0a5;
      uStack_d1c = 0xc2b0c0a5;
      uStack_d18 = 0xc2b0c0a5;
      uStack_d14 = 0xc2b0c0a5;
      uStack_d10 = 0xc2b0c0a5;
      uStack_d0c = 0xc2b0c0a5;
      uStack_d08 = 0xc2b0c0a5;
      uStack_d04 = 0xc2b0c0a5;
      auVar40._8_4_ = 0xc2b0c0a5;
      auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar40._12_4_ = 0xc2b0c0a5;
      auVar40._16_4_ = 0xc2b0c0a5;
      auVar40._20_4_ = 0xc2b0c0a5;
      auVar40._24_4_ = 0xc2b0c0a5;
      auVar40._28_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar21,auVar40);
      local_cd8 = local_ec0;
      local_c40 = ::_ps256_cephes_LOG2EF;
      local_c48 = ::_ps256_0p5;
      local_ec0._0_8_ = auVar19._0_8_;
      local_aa0 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar19._8_8_;
      uStack_a98 = local_ec0._8_8_;
      local_ec0._16_8_ = auVar19._16_8_;
      uStack_a90 = local_ec0._16_8_;
      local_ec0._24_8_ = auVar19._24_8_;
      uStack_a88 = local_ec0._24_8_;
      local_ac0[0] = 1.442695;
      local_ac0[1] = 1.442695;
      afStack_ab8[0] = 1.442695;
      afStack_ab8[1] = 1.442695;
      afStack_ab0[0] = 1.442695;
      afStack_ab0[1] = 1.442695;
      afStack_aa8[0] = 1.442695;
      afStack_aa8[1] = 1.442695;
      local_ae0[0] = 0.5;
      local_ae0[1] = 0.5;
      afStack_ad8[0] = 0.5;
      afStack_ad8[1] = 0.5;
      afStack_ad0[0] = 0.5;
      afStack_ad0[1] = 0.5;
      afStack_ac8[0] = 0.5;
      afStack_ac8[1] = 0.5;
      auVar42._8_4_ = 1.442695;
      auVar42._12_4_ = 1.442695;
      auVar42._0_4_ = 1.442695;
      auVar42._4_4_ = 1.442695;
      auVar42._16_4_ = 1.442695;
      auVar42._20_4_ = 1.442695;
      auVar42._24_4_ = 1.442695;
      auVar42._28_4_ = 1.442695;
      auVar41._8_4_ = 0.5;
      auVar41._12_4_ = 0.5;
      auVar41._0_4_ = 0.5;
      auVar41._4_4_ = 0.5;
      auVar41._16_4_ = 0.5;
      auVar41._20_4_ = 0.5;
      auVar41._24_4_ = 0.5;
      auVar41._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar42,auVar19,auVar41);
      auVar20 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar21 = vcmpps_avx(ZEXT1632(auVar17),auVar20,1);
      local_f60._0_8_ = auVar21._0_8_;
      local_e60 = local_f60._0_8_;
      local_f60._8_8_ = auVar21._8_8_;
      uStack_e58 = local_f60._8_8_;
      local_f60._16_8_ = auVar21._16_8_;
      uStack_e50 = local_f60._16_8_;
      local_f60._24_8_ = auVar21._24_8_;
      uStack_e48 = local_f60._24_8_;
      local_e80 = 0x3f8000003f800000;
      uStack_e78 = 0x3f8000003f800000;
      uStack_e70 = 0x3f8000003f800000;
      uStack_e68 = 0x3f8000003f800000;
      auVar39._8_8_ = 0x3f8000003f800000;
      auVar39._0_8_ = 0x3f8000003f800000;
      auVar39._16_8_ = 0x3f8000003f800000;
      auVar39._24_8_ = 0x3f8000003f800000;
      local_f60 = vpand_avx2(auVar21,auVar39);
      local_ee0 = auVar20._0_8_;
      local_e20 = local_ee0;
      uStack_ed8 = auVar20._8_8_;
      uStack_e18 = uStack_ed8;
      uStack_ed0 = auVar20._16_8_;
      uStack_e10 = uStack_ed0;
      uStack_ec8 = auVar20._24_8_;
      uStack_e08 = uStack_ec8;
      local_e40 = local_f60._0_8_;
      uStack_e38 = local_f60._8_8_;
      uStack_e30 = local_f60._16_8_;
      uStack_e28 = local_f60._24_8_;
      local_f00 = vsubps_avx(auVar20,local_f60);
      local_c20 = local_f00;
      local_c10 = ::_ps256_cephes_exp_C1;
      local_800 = local_f00._0_8_;
      uStack_7f8 = local_f00._8_8_;
      uStack_7f0 = local_f00._16_8_;
      uStack_7e8 = local_f00._24_8_;
      local_820[0] = 0.6933594;
      local_820[1] = 0.6933594;
      afStack_818[0] = 0.6933594;
      afStack_818[1] = 0.6933594;
      afStack_810[0] = 0.6933594;
      afStack_810[1] = 0.6933594;
      afStack_808[0] = 0.6933594;
      afStack_808[1] = 0.6933594;
      local_840 = local_ec0._0_8_;
      uStack_838 = local_ec0._8_8_;
      uStack_830 = local_ec0._16_8_;
      uStack_828 = local_ec0._24_8_;
      auVar48._8_4_ = 0.6933594;
      auVar48._12_4_ = 0.6933594;
      auVar48._0_4_ = 0.6933594;
      auVar48._4_4_ = 0.6933594;
      auVar48._16_4_ = 0.6933594;
      auVar48._20_4_ = 0.6933594;
      auVar48._24_4_ = 0.6933594;
      auVar48._28_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar48,local_f00,auVar19);
      local_c28 = ::_ps256_cephes_exp_C2;
      local_7a0 = local_f00._0_8_;
      uStack_798 = local_f00._8_8_;
      uStack_790 = local_f00._16_8_;
      uStack_788 = local_f00._24_8_;
      local_7c0[0] = -0.00021219444;
      local_7c0[1] = -0.00021219444;
      afStack_7b8[0] = -0.00021219444;
      afStack_7b8[1] = -0.00021219444;
      afStack_7b0[0] = -0.00021219444;
      afStack_7b0[1] = -0.00021219444;
      afStack_7a8[0] = -0.00021219444;
      afStack_7a8[1] = -0.00021219444;
      local_ec0._0_8_ = auVar17._0_8_;
      local_7e0 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar17._8_8_;
      uStack_7d8 = local_ec0._8_8_;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      auVar49._8_4_ = -0.00021219444;
      auVar49._12_4_ = -0.00021219444;
      auVar49._0_4_ = -0.00021219444;
      auVar49._4_4_ = -0.00021219444;
      auVar49._16_4_ = -0.00021219444;
      auVar49._20_4_ = -0.00021219444;
      auVar49._24_4_ = -0.00021219444;
      auVar49._28_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar49,local_f00,ZEXT1632(auVar17));
      auVar77 = ZEXT1632(auVar17);
      local_ec0._0_8_ = auVar17._0_8_;
      local_da0 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar17._8_8_;
      uStack_d98 = local_ec0._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_d80._0_4_ = auVar17._0_4_;
      local_d80._4_4_ = auVar17._4_4_;
      uStack_d78._0_4_ = auVar17._8_4_;
      uStack_d78._4_4_ = auVar17._12_4_;
      local_ee0._4_4_ = local_d80._4_4_ * local_d80._4_4_;
      local_ee0._0_4_ = (float)local_d80 * (float)local_d80;
      local_880 = local_ee0;
      uStack_ed8._0_4_ = (float)uStack_d78 * (float)uStack_d78;
      uStack_ed8._4_4_ = uStack_d78._4_4_ * uStack_d78._4_4_;
      auVar16 = _local_ee0;
      _local_ee0 = ZEXT1632(_local_ee0);
      auVar39 = _local_ee0;
      uStack_f78._0_4_ = 0x39506967;
      local_f80 = (undefined1  [8])0x3950696739506967;
      uStack_f78._4_4_ = 0x39506967;
      uStack_f70._0_4_ = 0x39506967;
      uStack_f70._4_4_ = 0x39506967;
      auVar68 = _local_f80;
      uStack_f68._0_4_ = 0x39506967;
      uStack_f68._4_4_ = 0x39506967;
      auVar21 = _local_f80;
      local_cc8 = local_f80;
      local_c60 = ::_ps256_cephes_exp_p1;
      local_a40 = 0x3950696739506967;
      uStack_a38 = uStack_f78;
      uStack_f70 = auVar68._16_8_;
      uStack_a30 = uStack_f70;
      uStack_f68 = auVar21._24_8_;
      uStack_a28 = uStack_f68;
      local_a60 = local_ec0._0_8_;
      uStack_a58 = local_ec0._8_8_;
      uStack_a50 = 0;
      uStack_a48 = 0;
      local_a80[0] = 0.0013981999;
      local_a80[1] = 0.0013981999;
      afStack_a78[0] = 0.0013981999;
      afStack_a78[1] = 0.0013981999;
      afStack_a70[0] = 0.0013981999;
      afStack_a70[1] = 0.0013981999;
      afStack_a68[0] = 0.0013981999;
      afStack_a68[1] = 0.0013981999;
      auVar43._8_4_ = 0.0013981999;
      auVar43._12_4_ = 0.0013981999;
      auVar43._0_4_ = 0.0013981999;
      auVar43._4_4_ = 0.0013981999;
      auVar43._16_4_ = 0.0013981999;
      auVar43._20_4_ = 0.0013981999;
      auVar43._24_4_ = 0.0013981999;
      auVar43._28_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(auVar77,auVar21,auVar43);
      local_c78 = ::_ps256_cephes_exp_p2;
      local_f80 = auVar17._0_8_;
      local_9e0 = local_f80;
      uStack_f78 = auVar17._8_8_;
      uStack_9d8 = uStack_f78;
      uStack_9d0 = 0;
      uStack_9c8 = 0;
      local_a00 = local_ec0._0_8_;
      uStack_9f8 = local_ec0._8_8_;
      uStack_9f0 = 0;
      uStack_9e8 = 0;
      local_a20[0] = 0.008333452;
      local_a20[1] = 0.008333452;
      afStack_a18[0] = 0.008333452;
      afStack_a18[1] = 0.008333452;
      afStack_a10[0] = 0.008333452;
      afStack_a10[1] = 0.008333452;
      afStack_a08[0] = 0.008333452;
      afStack_a08[1] = 0.008333452;
      auVar44._8_4_ = 0.008333452;
      auVar44._12_4_ = 0.008333452;
      auVar44._0_4_ = 0.008333452;
      auVar44._4_4_ = 0.008333452;
      auVar44._16_4_ = 0.008333452;
      auVar44._20_4_ = 0.008333452;
      auVar44._24_4_ = 0.008333452;
      auVar44._28_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar17),auVar44);
      local_c90 = ::_ps256_cephes_exp_p3;
      local_f80 = auVar17._0_8_;
      local_980 = local_f80;
      uStack_f78 = auVar17._8_8_;
      uStack_978 = uStack_f78;
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0 = local_ec0._0_8_;
      uStack_998 = local_ec0._8_8_;
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0[0] = 0.041665796;
      local_9c0[1] = 0.041665796;
      afStack_9b8[0] = 0.041665796;
      afStack_9b8[1] = 0.041665796;
      afStack_9b0[0] = 0.041665796;
      afStack_9b0[1] = 0.041665796;
      afStack_9a8[0] = 0.041665796;
      afStack_9a8[1] = 0.041665796;
      auVar45._8_4_ = 0.041665796;
      auVar45._12_4_ = 0.041665796;
      auVar45._0_4_ = 0.041665796;
      auVar45._4_4_ = 0.041665796;
      auVar45._16_4_ = 0.041665796;
      auVar45._20_4_ = 0.041665796;
      auVar45._24_4_ = 0.041665796;
      auVar45._28_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar17),auVar45);
      local_ca8 = ::_ps256_cephes_exp_p4;
      local_f80 = auVar17._0_8_;
      local_920 = local_f80;
      uStack_f78 = auVar17._8_8_;
      uStack_918 = uStack_f78;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = local_ec0._0_8_;
      uStack_938 = local_ec0._8_8_;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960[0] = 0.16666666;
      local_960[1] = 0.16666666;
      afStack_958[0] = 0.16666666;
      afStack_958[1] = 0.16666666;
      afStack_950[0] = 0.16666666;
      afStack_950[1] = 0.16666666;
      afStack_948[0] = 0.16666666;
      afStack_948[1] = 0.16666666;
      auVar46._8_4_ = 0.16666666;
      auVar46._12_4_ = 0.16666666;
      auVar46._0_4_ = 0.16666666;
      auVar46._4_4_ = 0.16666666;
      auVar46._16_4_ = 0.16666666;
      auVar46._20_4_ = 0.16666666;
      auVar46._24_4_ = 0.16666666;
      auVar46._28_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar17),auVar46);
      local_cc0 = ::_ps256_cephes_exp_p5;
      local_f80 = auVar17._0_8_;
      local_8c0 = local_f80;
      uStack_f78 = auVar17._8_8_;
      uStack_8b8 = uStack_f78;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0 = local_ec0._0_8_;
      uStack_8d8 = local_ec0._8_8_;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900[0] = 0.5;
      local_900[1] = 0.5;
      afStack_8f8[0] = 0.5;
      afStack_8f8[1] = 0.5;
      afStack_8f0[0] = 0.5;
      afStack_8f0[1] = 0.5;
      afStack_8e8[0] = 0.5;
      afStack_8e8[1] = 0.5;
      auVar47._8_4_ = 0.5;
      auVar47._12_4_ = 0.5;
      auVar47._0_4_ = 0.5;
      auVar47._4_4_ = 0.5;
      auVar47._16_4_ = 0.5;
      auVar47._20_4_ = 0.5;
      auVar47._24_4_ = 0.5;
      auVar47._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar17),auVar47);
      local_cd0 = local_ee0;
      local_f80 = auVar17._0_8_;
      local_860 = local_f80;
      uStack_f78 = auVar17._8_8_;
      uStack_858 = uStack_f78;
      uStack_850 = 0;
      uStack_848 = 0;
      uStack_ed8 = auVar16._8_8_;
      uStack_878 = uStack_ed8;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0 = local_ec0._0_8_;
      uStack_898 = local_ec0._8_8_;
      uStack_890 = 0;
      uStack_888 = 0;
      auVar17 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar17),auVar77);
      local_f80 = auVar17._0_8_;
      uVar22 = local_f80;
      uStack_f78 = auVar17._8_8_;
      uVar23 = uStack_f78;
      uStack_bd0 = 0;
      uStack_bc8 = 0;
      local_c00 = 0x3f8000003f800000;
      uStack_bf8 = 0x3f8000003f800000;
      uStack_bf0 = 0x3f8000003f800000;
      uStack_be8 = 0x3f8000003f800000;
      local_be0._0_4_ = auVar17._0_4_;
      local_be0._4_4_ = auVar17._4_4_;
      uStack_bd8._0_4_ = auVar17._8_4_;
      uStack_bd8._4_4_ = auVar17._12_4_;
      local_f80._4_4_ = local_be0._4_4_ + 1.0;
      local_f80._0_4_ = (float)local_be0 + 1.0;
      uStack_f78._0_4_ = (float)uStack_bd8 + 1.0;
      uStack_f78._4_4_ = uStack_bd8._4_4_ + 1.0;
      uStack_f70._0_4_ = 0x3f800000;
      uStack_f70._4_4_ = 0x3f800000;
      auVar68 = _local_f80;
      uStack_f68._0_4_ = 0x3f800000;
      uStack_f68._4_4_ = 0x3f800000;
      auVar19 = _local_f80;
      local_b80._0_4_ = local_f00._0_4_;
      local_b80._4_4_ = local_f00._4_4_;
      uStack_b78._0_4_ = local_f00._8_4_;
      uStack_b78._4_4_ = local_f00._12_4_;
      uStack_b70._0_4_ = local_f00._16_4_;
      uStack_b70._4_4_ = local_f00._20_4_;
      uStack_b68._0_4_ = local_f00._24_4_;
      uStack_b68._4_4_ = local_f00._28_4_;
      local_f20._4_4_ = (int)local_b80._4_4_;
      local_f20._0_4_ = (int)(float)local_b80;
      local_f20._8_4_ = (int)(float)uStack_b78;
      local_f20._12_4_ = (int)uStack_b78._4_4_;
      local_f20._16_4_ = (int)(float)uStack_b70;
      local_f20._20_4_ = (int)uStack_b70._4_4_;
      auVar72 = local_f20._0_24_;
      local_f20._24_4_ = (int)(float)uStack_b68;
      local_f20._28_4_ = (int)uStack_b68._4_4_;
      auVar21 = local_f20;
      local_b40 = local_f20._0_8_;
      uStack_b38 = local_f20._8_8_;
      local_f20._16_8_ = auVar72._16_8_;
      uStack_b30 = local_f20._16_8_;
      local_f20._24_8_ = auVar21._24_8_;
      uStack_b28 = local_f20._24_8_;
      local_b60 = 0x7f0000007f;
      uStack_b58 = 0x7f0000007f;
      uStack_b50 = 0x7f0000007f;
      uStack_b48 = 0x7f0000007f;
      local_760 = local_f20._0_8_;
      uStack_758 = local_f20._8_8_;
      uStack_750 = local_f20._16_8_;
      uStack_748 = local_f20._24_8_;
      local_780 = 0x7f0000007f;
      uStack_778 = 0x7f0000007f;
      uStack_770 = 0x7f0000007f;
      uStack_768 = 0x7f0000007f;
      auVar51._16_8_ = local_f20._16_8_;
      auVar51._0_16_ = local_f20._0_16_;
      auVar51._24_8_ = local_f20._24_8_;
      auVar50._8_8_ = 0x7f0000007f;
      auVar50._0_8_ = 0x7f0000007f;
      auVar50._16_8_ = 0x7f0000007f;
      auVar50._24_8_ = 0x7f0000007f;
      auVar21 = vpaddd_avx2(auVar51,auVar50);
      local_f20._0_8_ = auVar21._0_8_;
      local_b00 = local_f20._0_8_;
      local_f20._8_8_ = auVar21._8_8_;
      uStack_af8 = local_f20._8_8_;
      local_f20._16_8_ = auVar21._16_8_;
      uStack_af0 = local_f20._16_8_;
      local_f20._24_8_ = auVar21._24_8_;
      uStack_ae8 = local_f20._24_8_;
      local_b04 = 0x17;
      local_720 = local_f20._0_8_;
      uStack_718 = local_f20._8_8_;
      uStack_710 = local_f20._16_8_;
      uStack_708 = local_f20._24_8_;
      local_724 = 0x17;
      local_f20 = vpslld_avx2(auVar21,ZEXT416(0x17));
      local_ea0 = local_f20._0_8_;
      uStack_e98 = local_f20._8_8_;
      uStack_e90 = local_f20._16_8_;
      uStack_e88 = local_f20._24_8_;
      local_fa0 = local_f20._0_8_;
      uStack_f98 = local_f20._8_8_;
      uStack_f90 = local_f20._16_8_;
      uStack_f88 = local_f20._24_8_;
      local_dc0 = local_f80;
      uStack_db8 = uStack_f78;
      uStack_f70 = auVar68._16_8_;
      uStack_db0 = uStack_f70;
      uStack_f68 = auVar19._24_8_;
      uStack_da8 = uStack_f68;
      local_de0._0_4_ = local_f20._0_4_;
      local_de0._4_4_ = local_f20._4_4_;
      uStack_dd8._0_4_ = local_f20._8_4_;
      uStack_dd8._4_4_ = local_f20._12_4_;
      uStack_dd0._0_4_ = local_f20._16_4_;
      uStack_dd0._4_4_ = local_f20._20_4_;
      uStack_dc8._0_4_ = local_f20._24_4_;
      local_f80._0_4_ = ((float)local_be0 + 1.0) * (float)local_de0;
      local_f80._4_4_ = (local_be0._4_4_ + 1.0) * local_de0._4_4_;
      uStack_dd8._0_4_ = ((float)uStack_bd8 + 1.0) * (float)uStack_dd8;
      uStack_dd8._4_4_ = (uStack_bd8._4_4_ + 1.0) * uStack_dd8._4_4_;
      uStack_f78._0_4_ = (float)uStack_dd8;
      uStack_f78._4_4_ = uStack_dd8._4_4_;
      uStack_f70._0_4_ = (float)uStack_dd0 * 1.0;
      uStack_f70._4_4_ = uStack_dd0._4_4_ * 1.0;
      auVar68 = _local_f80;
      uStack_f68._0_4_ = (float)uStack_dc8 * 1.0;
      uStack_f68._4_4_ = 0x3f800000;
      auVar20 = _local_f80;
      local_bc0 = local_f80;
      uStack_bb8 = uStack_f78;
      uStack_f70 = auVar68._16_8_;
      uStack_bb0 = uStack_f70;
      uStack_f68 = auVar20._24_8_;
      uStack_ba8 = uStack_f68;
      local_ba0._0_4_ = local_6a0._0_4_;
      local_ba0._4_4_ = local_6a0._4_4_;
      uStack_b98._0_4_ = local_6a0._8_4_;
      uStack_b98._4_4_ = local_6a0._12_4_;
      uStack_b90._0_4_ = auStack_690._0_4_;
      uStack_b90._4_4_ = auStack_690._4_4_;
      uStack_b88._0_4_ = auStack_690._8_4_;
      uStack_b88._4_4_ = auStack_690._12_4_;
      local_6e0 = (float)local_ba0 + (float)local_f80._0_4_;
      fStack_6dc = local_ba0._4_4_ + (float)local_f80._4_4_;
      fStack_6d8 = (float)uStack_b98 + (float)uStack_dd8;
      fStack_6d4 = uStack_b98._4_4_ + uStack_dd8._4_4_;
      fStack_6d0 = (float)uStack_b90 + (float)uStack_dd0 * 1.0;
      fStack_6cc = uStack_b90._4_4_ + uStack_dd0._4_4_ * 1.0;
      fStack_6c8 = (float)uStack_b88 + (float)uStack_dc8 * 1.0;
      fStack_6c4 = uStack_b88._4_4_ + 1.0;
      auVar53._16_8_ = auStack_690._0_8_;
      auVar53._0_16_ = local_6a0;
      auVar53._24_8_ = auStack_690._8_8_;
      auVar52._4_4_ = fStack_6dc;
      auVar52._0_4_ = local_6e0;
      auVar52._8_4_ = fStack_6d8;
      auVar52._12_4_ = fStack_6d4;
      auVar52._16_4_ = fStack_6d0;
      auVar52._20_4_ = fStack_6cc;
      auVar52._24_4_ = fStack_6c8;
      auVar52._28_4_ = fStack_6c4;
      local_1060 = vdivps_avx(auVar53,auVar52);
      local_1080 = local_10e0._0_8_;
      uStack_1078 = local_10e0._8_8_;
      uStack_1070 = auStack_10d0._0_8_;
      uStack_1068 = auStack_10d0._8_8_;
      local_10a0 = local_1120._0_8_;
      uStack_1098 = local_1120._8_8_;
      uStack_1090 = auStack_1110._0_8_;
      uStack_1088 = auStack_1110._8_8_;
      auVar19._16_8_ = auStack_10d0._0_8_;
      auVar19._0_16_ = local_10e0;
      auVar19._24_8_ = auStack_10d0._8_8_;
      auVar21._16_8_ = auStack_1110._0_8_;
      auVar21._0_16_ = local_1120;
      auVar21._24_8_ = auStack_1110._8_8_;
      auVar80._8_4_ = 0x80000000;
      auVar80._0_8_ = 0x8000000080000000;
      auVar80._12_4_ = 0x80000000;
      auVar80._16_4_ = 0x80000000;
      auVar80._20_4_ = 0x80000000;
      auVar80._24_4_ = 0x80000000;
      auVar80._28_4_ = 0x80000000;
      auVar17 = vfmadd213ps_fma(auVar19,local_1060,auVar21 ^ auVar80);
      local_2760 = local_2870;
      local_2920._0_8_ = auVar17._0_8_;
      local_2780 = local_2920._0_8_;
      local_2920._8_8_ = auVar17._8_8_;
      uStack_2778 = local_2920._8_8_;
      uStack_2770 = 0;
      uStack_2768 = 0;
      *(undefined1 (*) [32])*local_2870 = ZEXT1632(auVar17);
      local_2870 = (undefined1 (*) [64])(*local_2870 + 0x20);
      local_2920 = ZEXT1632(auVar17);
      local_1180 = local_10e0._0_8_;
      uStack_1178 = local_10e0._8_8_;
      uStack_1170 = auStack_10d0._0_8_;
      uStack_1168 = auStack_10d0._8_8_;
      local_1160 = local_11a0;
      uStack_1158 = uStack_1198;
      uStack_1150 = uStack_1190;
      uStack_1148 = uStack_1188;
      local_10fc = local_1100;
      local_10f8 = local_1100;
      local_10f4 = local_1100;
      local_10f0 = local_1100;
      local_10ec = local_1100;
      local_10e8 = local_1100;
      local_10e4 = local_1100;
      local_10bc = local_10c0;
      local_10b8 = local_10c0;
      local_10b4 = local_10c0;
      local_10b0 = local_10c0;
      local_10ac = local_10c0;
      local_10a8 = local_10c0;
      local_10a4 = local_10c0;
      _local_f80 = auVar20;
      _local_ee0 = auVar39;
      local_ec0 = auVar77;
      local_de0 = local_f20._0_8_;
      uStack_dd8 = local_f20._8_8_;
      uStack_dd0 = local_f20._16_8_;
      uStack_dc8 = local_f20._24_8_;
      local_d80 = local_da0;
      uStack_d78 = uStack_d98;
      uStack_d70 = uStack_d90;
      uStack_d68 = uStack_d88;
      local_cb8 = local_cd8;
      local_cb0 = local_cc8;
      local_ca0 = local_cd8;
      local_c98 = local_cc8;
      local_c88 = local_cd8;
      local_c80 = local_cc8;
      local_c70 = local_cd8;
      local_c68 = local_cc8;
      local_c58 = local_cd8;
      local_c50 = local_cc8;
      local_c38 = local_cd8;
      local_c30 = local_cd8;
      local_c18 = local_cd8;
      local_c08 = local_c20;
      local_be0 = uVar22;
      uStack_bd8 = uVar23;
      local_ba0 = local_6c0;
      uStack_b98 = uStack_6b8;
      uStack_b90 = uStack_6b0;
      uStack_b88 = uStack_6a8;
      local_b80 = local_f00._0_8_;
      uStack_b78 = local_f00._8_8_;
      uStack_b70 = local_f00._16_8_;
      uStack_b68 = local_f00._24_8_;
      local_67c = local_680;
      local_678 = local_680;
      local_674 = local_680;
      local_670 = local_680;
      local_66c = local_680;
      local_668 = local_680;
      local_664 = local_680;
    }
    for (; local_26e8 = local_2810, local_2898 = local_2738, local_28bc + 3 < local_2864;
        local_28bc = local_28bc + 4) {
      local_2758 = local_2870;
      auVar17 = *(undefined1 (*) [16])*local_2870;
      local_2698 = local_2849;
      local_26a0 = local_2930;
      local_2930._0_8_ = auVar17._0_8_;
      local_640 = local_2930._0_8_;
      local_2930._8_8_ = auVar17._8_8_;
      uStack_638 = local_2930._8_8_;
      local_594 = 0x3f800000;
      local_5b0 = 0x3f800000;
      local_650 = 0x3f8000003f800000;
      uStack_648 = 0x3f8000003f800000;
      local_5b4 = 0x40000000;
      local_5d0 = 0x40000000;
      local_660 = 0x4000000040000000;
      uStack_658 = 0x4000000040000000;
      local_5e0._0_4_ = auVar17._0_4_;
      local_5e0._4_4_ = auVar17._4_4_;
      uStack_5d8._0_4_ = auVar17._8_4_;
      uStack_5d8._4_4_ = auVar17._12_4_;
      local_580 = (float)local_5e0 * 2.0;
      fStack_57c = local_5e0._4_4_ * 2.0;
      fStack_578 = (float)uStack_5d8 * 2.0;
      fStack_574 = uStack_5d8._4_4_ * 2.0;
      local_74 = 0x3f800000;
      local_90 = 0x3f800000;
      local_590 = 0x3f8000003f800000;
      uStack_588 = 0x3f8000003f800000;
      local_370._8_8_ = 0x3f8000003f800000;
      local_370._0_8_ = 0x3f8000003f800000;
      local_550 = (undefined1  [16])0x0;
      local_560 = 0;
      uStack_558 = 0;
      local_570 = CONCAT44(fStack_57c,local_580);
      uStack_568 = CONCAT44(fStack_574,fStack_578);
      auVar16._8_8_ = uStack_568;
      auVar16._0_8_ = local_570;
      auVar17 = vsubps_avx(ZEXT816(0),auVar16);
      local_470 = (undefined1  [16])0x0;
      local_510 = 0x3f800000;
      uStack_50c = 0x3f800000;
      uStack_508 = 0x3f800000;
      uStack_504 = 0x3f800000;
      local_4d0._0_8_ = auVar17._0_8_;
      local_3f0 = local_4d0._0_8_;
      local_4d0._8_8_ = auVar17._8_8_;
      uStack_3e8 = local_4d0._8_8_;
      local_400 = 0x42b0c0a5;
      uStack_3fc = 0x42b0c0a5;
      uStack_3f8 = 0x42b0c0a5;
      uStack_3f4 = 0x42b0c0a5;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar17,auVar18);
      local_4d0._0_8_ = auVar17._0_8_;
      local_3d0 = local_4d0._0_8_;
      local_4d0._8_8_ = auVar17._8_8_;
      uStack_3c8 = local_4d0._8_8_;
      local_3e0 = 0xc2b0c0a5;
      uStack_3dc = 0xc2b0c0a5;
      uStack_3d8 = 0xc2b0c0a5;
      uStack_3d4 = 0xc2b0c0a5;
      auVar55._8_4_ = 0xc2b0c0a5;
      auVar55._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar55._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar17,auVar55);
      local_4d0._0_8_ = auVar18._0_8_;
      uVar22 = local_4d0._0_8_;
      local_4d0._8_8_ = auVar18._8_8_;
      uVar23 = local_4d0._8_8_;
      local_420 = 0x3fb8aa3b;
      uStack_41c = 0x3fb8aa3b;
      uStack_418 = 0x3fb8aa3b;
      uStack_414 = 0x3fb8aa3b;
      local_410._0_4_ = auVar18._0_4_;
      local_410._4_4_ = auVar18._4_4_;
      uStack_408._0_4_ = auVar18._8_4_;
      uStack_408._4_4_ = auVar18._12_4_;
      local_4f0._4_4_ = local_410._4_4_ * 1.442695;
      local_4f0._0_4_ = (float)local_410 * 1.442695;
      uStack_4e8._0_4_ = (float)uStack_408 * 1.442695;
      uStack_4e8._4_4_ = uStack_408._4_4_ * 1.442695;
      local_390 = local_4f0;
      uStack_388 = uStack_4e8;
      local_3a0 = 0x3f000000;
      uStack_39c = 0x3f000000;
      uStack_398 = 0x3f000000;
      uStack_394 = 0x3f000000;
      local_4f0._0_4_ = (float)local_410 * 1.442695 + 0.5;
      local_4f0._4_4_ = local_410._4_4_ * 1.442695 + 0.5;
      fVar78 = (float)uStack_408 * 1.442695 + 0.5;
      fVar79 = uStack_408._4_4_ * 1.442695 + 0.5;
      uStack_4e8._0_4_ = fVar78;
      uStack_4e8._4_4_ = fVar79;
      local_350 = local_4f0;
      uStack_348 = uStack_4e8;
      local_500._4_4_ = (int)(float)local_4f0._4_4_;
      local_500._0_4_ = (int)(float)local_4f0._0_4_;
      local_500._8_4_ = (int)fVar78;
      local_500._12_4_ = (int)fVar79;
      local_340 = local_500._0_8_;
      uStack_338 = local_500._8_8_;
      auVar56._8_8_ = local_500._8_8_;
      auVar56._0_8_ = local_500._0_8_;
      auVar16 = vcvtdq2ps_avx(auVar56);
      local_4e0 = auVar16._0_8_;
      local_320 = local_4e0;
      uStack_4d8 = auVar16._8_8_;
      uStack_318 = uStack_4d8;
      local_330 = local_4f0;
      uStack_328 = uStack_4e8;
      auVar57._8_8_ = uStack_4e8;
      auVar57._0_8_ = local_4f0;
      auVar17 = vcmpps_avx(auVar57,auVar16,1);
      local_520._0_8_ = auVar17._0_8_;
      local_4a0 = local_520._0_8_;
      local_520._8_8_ = auVar17._8_8_;
      uStack_498 = local_520._8_8_;
      local_4b0 = 0x3f8000003f800000;
      uStack_4a8 = 0x3f8000003f800000;
      auVar54._8_8_ = 0x3f8000003f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      local_520 = vpand_avx(auVar17,auVar54);
      local_480 = local_4e0;
      uStack_478 = uStack_4d8;
      local_490 = local_520._0_8_;
      uStack_488 = local_520._8_8_;
      _local_4f0 = vsubps_avx(auVar16,local_520);
      local_300 = local_4f0;
      local_2f0 = ::_ps_cephes_exp_C1;
      local_310 = local_4d0;
      local_1f0 = local_4f0;
      uStack_1e8 = uStack_4e8;
      local_200[0] = 0.6933594;
      local_200[1] = 0.6933594;
      afStack_1f8[0] = 0.6933594;
      afStack_1f8[1] = 0.6933594;
      local_210 = local_4d0._0_8_;
      uStack_208 = local_4d0._8_8_;
      auVar60._8_4_ = 0.6933594;
      auVar60._12_4_ = 0.6933594;
      auVar60._0_4_ = 0.6933594;
      auVar60._4_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar60,_local_4f0,auVar18);
      local_308 = ::_ps_cephes_exp_C2;
      local_1c0 = local_4f0;
      uStack_1b8 = uStack_4e8;
      local_1d0[0] = -0.00021219444;
      local_1d0[1] = -0.00021219444;
      afStack_1c8[0] = -0.00021219444;
      afStack_1c8[1] = -0.00021219444;
      local_4d0._0_8_ = auVar17._0_8_;
      local_1e0 = local_4d0._0_8_;
      local_4d0._8_8_ = auVar17._8_8_;
      uStack_1d8 = local_4d0._8_8_;
      auVar61._8_4_ = -0.00021219444;
      auVar61._12_4_ = -0.00021219444;
      auVar61._0_4_ = -0.00021219444;
      auVar61._4_4_ = -0.00021219444;
      local_4d0 = vfnmadd213ps_fma(auVar61,_local_4f0,auVar17);
      local_440 = local_4d0._0_8_;
      uStack_438 = local_4d0._8_8_;
      local_430._0_4_ = local_4d0._0_4_;
      local_430._4_4_ = local_4d0._4_4_;
      uStack_428._0_4_ = local_4d0._8_4_;
      uStack_428._4_4_ = local_4d0._12_4_;
      local_4e0._4_4_ = local_430._4_4_ * local_430._4_4_;
      local_4e0._0_4_ = (float)local_430 * (float)local_430;
      uStack_4d8._0_4_ = (float)uStack_428 * (float)uStack_428;
      uStack_4d8._4_4_ = uStack_428._4_4_ * uStack_428._4_4_;
      uStack_528._0_4_ = 0x39506967;
      local_530 = (undefined1  [8])0x3950696739506967;
      uStack_528._4_4_ = 0x39506967;
      local_2d0 = local_530;
      local_268 = ::_ps_cephes_exp_p1;
      local_190 = 0x3950696739506967;
      uStack_188 = uStack_528;
      local_1a0 = local_4d0._0_8_;
      uStack_198 = local_4d0._8_8_;
      local_1b0[0] = 0.0013981999;
      local_1b0[1] = 0.0013981999;
      afStack_1a8[0] = 0.0013981999;
      afStack_1a8[1] = 0.0013981999;
      auVar62._8_4_ = 0.0013981999;
      auVar62._12_4_ = 0.0013981999;
      auVar62._0_4_ = 0.0013981999;
      auVar62._4_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(local_4d0,_local_530,auVar62);
      local_280 = ::_ps_cephes_exp_p2;
      local_530 = auVar17._0_8_;
      local_160 = local_530;
      uStack_528 = auVar17._8_8_;
      uStack_158 = uStack_528;
      local_170 = local_4d0._0_8_;
      uStack_168 = local_4d0._8_8_;
      local_180[0] = 0.008333452;
      local_180[1] = 0.008333452;
      afStack_178[0] = 0.008333452;
      afStack_178[1] = 0.008333452;
      auVar63._8_4_ = 0.008333452;
      auVar63._12_4_ = 0.008333452;
      auVar63._0_4_ = 0.008333452;
      auVar63._4_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(local_4d0,auVar17,auVar63);
      local_298 = ::_ps_cephes_exp_p3;
      local_530 = auVar17._0_8_;
      local_130 = local_530;
      uStack_528 = auVar17._8_8_;
      uStack_128 = uStack_528;
      local_140 = local_4d0._0_8_;
      uStack_138 = local_4d0._8_8_;
      local_150[0] = 0.041665796;
      local_150[1] = 0.041665796;
      afStack_148[0] = 0.041665796;
      afStack_148[1] = 0.041665796;
      auVar64._8_4_ = 0.041665796;
      auVar64._12_4_ = 0.041665796;
      auVar64._0_4_ = 0.041665796;
      auVar64._4_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(local_4d0,auVar17,auVar64);
      local_2b0 = ::_ps_cephes_exp_p4;
      local_530 = auVar17._0_8_;
      local_100 = local_530;
      uStack_528 = auVar17._8_8_;
      uStack_f8 = uStack_528;
      local_110 = local_4d0._0_8_;
      uStack_108 = local_4d0._8_8_;
      local_120[0] = 0.16666666;
      local_120[1] = 0.16666666;
      afStack_118[0] = 0.16666666;
      afStack_118[1] = 0.16666666;
      auVar65._8_4_ = 0.16666666;
      auVar65._12_4_ = 0.16666666;
      auVar65._0_4_ = 0.16666666;
      auVar65._4_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(local_4d0,auVar17,auVar65);
      local_2c8 = ::_ps_cephes_exp_p5;
      local_530 = auVar17._0_8_;
      local_d0 = local_530;
      uStack_528 = auVar17._8_8_;
      uStack_c8 = uStack_528;
      local_e0 = local_4d0._0_8_;
      uStack_d8 = local_4d0._8_8_;
      local_f0[0] = 0.5;
      local_f0[1] = 0.5;
      afStack_e8[0] = 0.5;
      afStack_e8[1] = 0.5;
      auVar66._8_4_ = 0.5;
      auVar66._12_4_ = 0.5;
      auVar66._0_4_ = 0.5;
      auVar66._4_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(local_4d0,auVar17,auVar66);
      local_2d8 = local_4e0;
      local_530 = auVar17._0_8_;
      local_a0 = local_530;
      uStack_528 = auVar17._8_8_;
      uStack_98 = uStack_528;
      local_b0 = local_4e0;
      uStack_a8 = uStack_4d8;
      local_c0 = local_4d0._0_8_;
      uStack_b8 = local_4d0._8_8_;
      auVar17 = vfmadd213ps_fma(_local_4e0,auVar17,local_4d0);
      local_530 = auVar17._0_8_;
      uVar24 = local_530;
      uStack_528 = auVar17._8_8_;
      uVar25 = uStack_528;
      local_3c0 = 0x3f8000003f800000;
      uStack_3b8 = 0x3f8000003f800000;
      local_3b0._0_4_ = auVar17._0_4_;
      local_3b0._4_4_ = auVar17._4_4_;
      uStack_3a8._0_4_ = auVar17._8_4_;
      uStack_3a8._4_4_ = auVar17._12_4_;
      local_530._4_4_ = local_3b0._4_4_ + 1.0;
      local_530._0_4_ = (float)local_3b0 + 1.0;
      uStack_528._0_4_ = (float)uStack_3a8 + 1.0;
      uStack_528._4_4_ = uStack_3a8._4_4_ + 1.0;
      local_360._0_4_ = local_4f0._0_4_;
      local_360._4_4_ = local_4f0._4_4_;
      uStack_358._0_4_ = local_4f0._8_4_;
      uStack_358._4_4_ = local_4f0._12_4_;
      local_500._4_4_ = (int)local_360._4_4_;
      local_500._0_4_ = (int)(float)local_360;
      local_500._8_4_ = (int)(float)uStack_358;
      local_500._12_4_ = (int)uStack_358._4_4_;
      local_240 = local_500._0_8_;
      uStack_238 = local_500._8_8_;
      local_250 = 0x7f0000007f;
      uStack_248 = 0x7f0000007f;
      auVar59._8_8_ = local_500._8_8_;
      auVar59._0_8_ = local_500._0_8_;
      auVar58._8_8_ = 0x7f0000007f;
      auVar58._0_8_ = 0x7f0000007f;
      auVar17 = vpaddd_avx(auVar59,auVar58);
      local_500._0_8_ = auVar17._0_8_;
      local_220 = local_500._0_8_;
      local_500._8_8_ = auVar17._8_8_;
      uStack_218 = local_500._8_8_;
      local_224 = 0x17;
      local_500 = vpslld_avx(auVar17,ZEXT416(0x17));
      local_4c0 = local_500._0_8_;
      uStack_4b8 = local_500._8_8_;
      local_540 = local_500._0_8_;
      uStack_538 = local_500._8_8_;
      local_450 = _local_530;
      local_460._0_4_ = local_500._0_4_;
      local_460._4_4_ = local_500._4_4_;
      uStack_458._0_4_ = local_500._8_4_;
      uStack_458._4_4_ = local_500._12_4_;
      local_530._0_4_ = ((float)local_3b0 + 1.0) * (float)local_460;
      local_530._4_4_ = (local_3b0._4_4_ + 1.0) * local_460._4_4_;
      uStack_458._0_4_ = ((float)uStack_3a8 + 1.0) * (float)uStack_458;
      uStack_458._4_4_ = (uStack_3a8._4_4_ + 1.0) * uStack_458._4_4_;
      uStack_528._0_4_ = (float)uStack_458;
      uStack_528._4_4_ = uStack_458._4_4_;
      local_380 = local_530;
      uStack_378 = uStack_528;
      local_70 = (float)local_530._0_4_ + 1.0;
      fStack_6c = (float)local_530._4_4_ + 1.0;
      fStack_68 = (float)uStack_458 + 1.0;
      fStack_64 = uStack_458._4_4_ + 1.0;
      auVar67._4_4_ = fStack_6c;
      auVar67._0_4_ = local_70;
      auVar67._8_4_ = fStack_68;
      auVar67._12_4_ = fStack_64;
      _local_600 = vdivps_avx(local_370,auVar67);
      local_620._0_4_ = (float)local_600._0_4_ * 2.0;
      local_620._4_4_ = (float)local_600._4_4_ * 2.0;
      local_620._8_4_ = fStack_5f8 * 2.0;
      local_620._12_4_ = fStack_5f4 * 2.0;
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      local_2930 = vsubps_avx(local_620,auVar17);
      local_2740 = local_2870;
      local_2750 = local_2930._0_8_;
      uStack_2748 = local_2930._8_8_;
      *(undefined1 (*) [16])*local_2870 = local_2930;
      local_2870 = (undefined1 (*) [64])(*local_2870 + 0x10);
      local_630 = local_650;
      uStack_628 = uStack_648;
      local_610 = local_660;
      uStack_608 = uStack_658;
      local_5f0 = local_660;
      uStack_5e8 = uStack_658;
      local_5e0 = local_640;
      uStack_5d8 = uStack_638;
      uStack_5cc = local_5d0;
      uStack_5c8 = local_5d0;
      uStack_5c4 = local_5d0;
      uStack_5ac = local_5b0;
      uStack_5a8 = local_5b0;
      uStack_5a4 = local_5b0;
      local_460 = local_500._0_8_;
      uStack_458 = local_500._8_8_;
      local_430 = local_440;
      uStack_428 = uStack_438;
      local_410 = uVar22;
      uStack_408 = uVar23;
      local_3b0 = uVar24;
      uStack_3a8 = uVar25;
      local_360 = local_4f0;
      uStack_358 = uStack_4e8;
      local_2f8 = local_310;
      local_2e8 = local_300;
      local_2e0 = local_310;
      local_2c0 = local_310;
      local_2b8 = local_2d0;
      local_2a8 = local_310;
      local_2a0 = local_2d0;
      local_290 = local_310;
      local_288 = local_2d0;
      local_278 = local_310;
      local_270 = local_2d0;
      local_260 = local_310;
      local_258 = local_2d0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      local_60 = local_370;
    }
    for (; local_28bc < local_2864; local_28bc = local_28bc + 1) {
      local_2688 = local_2849;
      local_2690 = local_2870;
      fVar78 = tanhf(*(float *)*local_2870);
      *(float *)*local_2870 = fVar78;
      local_2870 = (undefined1 (*) [64])(*local_2870 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}